

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O3

void test_bson_json_read_legacy_binary(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  long lVar6;
  char *pcVar7;
  undefined8 uVar8;
  char *__needle;
  void *pvVar9;
  void *pvVar10;
  undefined8 extraout_RAX;
  void *pvVar11;
  undefined8 extraout_RAX_00;
  undefined1 *__n;
  undefined1 *puVar12;
  undefined1 *puVar13;
  undefined8 extraout_RAX_01;
  void *__s2;
  undefined1 *puVar14;
  undefined8 extraout_RAX_02;
  int *__haystack;
  undefined8 extraout_RAX_03;
  long *plVar15;
  undefined8 extraout_RAX_04;
  undefined8 uVar16;
  undefined8 uVar17;
  char *pcVar18;
  ulong uVar19;
  ulong uVar20;
  undefined **ppuVar21;
  char *pcVar22;
  undefined **ppuVar23;
  long lVar24;
  undefined **ppuVar25;
  char *pcVar26;
  int *piVar27;
  char *unaff_R15;
  int *piVar28;
  double dVar29;
  int extraout_XMM0_Db;
  uint32_t len;
  bson_subtype_t subtype;
  uint8_t *binary;
  bson_t b;
  bson_error_t error;
  code **ppcVar30;
  undefined4 uStack_53dc;
  undefined8 uStack_53d8;
  undefined2 uStack_53d0;
  int iStack_53c8;
  int iStack_53c4;
  char acStack_53c0 [504];
  code *pcStack_51c8;
  undefined1 auStack_51b8 [512];
  char *pcStack_4fb8;
  code *pcStack_4fb0;
  int iStack_4fa0;
  int iStack_4f9c;
  char acStack_4f98 [504];
  long *plStack_4da0;
  char *pcStack_4d98;
  char *pcStack_4d90;
  undefined **ppuStack_4d88;
  long lStack_4d10;
  long lStack_4d08;
  undefined1 auStack_4d00 [128];
  undefined1 auStack_4c80 [232];
  undefined1 auStack_4b98 [608];
  long *plStack_4938;
  code *pcStack_4930;
  undefined1 auStack_4928 [8];
  char acStack_4920 [16];
  char *pcStack_4910;
  code *pcStack_4908;
  uint uStack_4884;
  undefined8 uStack_4880;
  undefined8 uStack_4878;
  undefined8 uStack_4870;
  undefined8 uStack_4868;
  undefined8 uStack_4860;
  undefined8 uStack_4858;
  undefined8 uStack_4850;
  undefined8 uStack_4848;
  undefined8 uStack_4840;
  undefined8 uStack_4838;
  undefined8 uStack_4830;
  undefined8 uStack_4828;
  undefined8 uStack_4820;
  undefined8 uStack_4818;
  undefined8 uStack_4810;
  undefined8 uStack_4808;
  undefined1 auStack_47b8 [648];
  int *piStack_4530;
  char *pcStack_4528;
  undefined **ppuStack_4520;
  undefined1 *puStack_4518;
  undefined **ppuStack_4510;
  code *pcStack_4508;
  undefined1 auStack_4500 [240];
  undefined1 auStack_4410 [648];
  code *apcStack_4188 [16];
  undefined *puStack_4108;
  undefined1 auStack_4100 [200];
  int iStack_4038;
  int iStack_4034;
  int aiStack_4030 [160];
  int *piStack_3db0;
  double *pdStack_3da8;
  undefined **ppuStack_3da0;
  int *piStack_3d98;
  int *piStack_3d90;
  code *apcStack_3d88 [16];
  double dStack_3d08;
  int aiStack_3d00 [50];
  int iStack_3c38;
  int iStack_3c34;
  int aiStack_3c30 [160];
  undefined8 uStack_39b0;
  undefined1 *puStack_39a8;
  char *pcStack_39a0;
  char *pcStack_3998;
  undefined **ppuStack_3990;
  code *pcStack_3988;
  int iStack_3980;
  int iStack_397c;
  char acStack_3978 [504];
  undefined1 auStack_3780 [336];
  char *pcStack_3630;
  undefined1 *puStack_3628;
  undefined1 *puStack_3620;
  void *pvStack_3618;
  void *pvStack_3610;
  code *pcStack_3608;
  undefined1 auStack_3600 [128];
  char acStack_3580 [232];
  undefined1 auStack_3498 [648];
  char *pcStack_3210;
  code *pcStack_3208;
  undefined1 auStack_3200 [128];
  char acStack_3180 [224];
  int iStack_30a0;
  int iStack_309c;
  char acStack_3098 [640];
  char *pcStack_2e18;
  void *pvStack_2e10;
  code *pcStack_2e08;
  undefined1 auStack_2e00 [128];
  char acStack_2d80 [232];
  undefined1 auStack_2c98 [648];
  char *pcStack_2a10;
  code *pcStack_2a08;
  undefined1 auStack_2a00 [232];
  int iStack_2918;
  int iStack_2914;
  char acStack_2910 [640];
  char *pcStack_2690;
  code *apcStack_2688 [16];
  uint uStack_2604;
  undefined1 auStack_2600 [4];
  uint uStack_25fc;
  undefined1 auStack_2538 [648];
  undefined1 *puStack_22b0;
  undefined1 *puStack_22a8;
  undefined1 *puStack_22a0;
  void *pvStack_2298;
  void *pvStack_2290;
  code *pcStack_2288;
  uint uStack_227c;
  void *pvStack_2278;
  char *pcStack_2270;
  void *pvStack_2268;
  char *pcStack_2260;
  void *pvStack_2258;
  char *pcStack_2250;
  undefined1 *puStack_2248;
  char *pcStack_2240;
  undefined1 *puStack_2238;
  char *pcStack_2230;
  undefined8 uStack_2228;
  char *pcStack_2220;
  undefined8 uStack_2218;
  char *pcStack_2210;
  undefined8 uStack_2208;
  undefined1 auStack_2200 [4];
  uint uStack_21fc;
  undefined1 auStack_2138 [592];
  undefined8 uStack_1ee8;
  char *pcStack_1ee0;
  char *pcStack_1ed8;
  char *pcStack_1ed0;
  char *pcStack_1ec8;
  char *pcStack_1ec0;
  char *pcStack_1eb8;
  char *pcStack_1eb0;
  char *pcStack_1ea8;
  char *pcStack_1ea0;
  char *pcStack_1e98;
  char *pcStack_1e90;
  code *apcStack_1e88 [7];
  undefined8 uStack_1e50;
  void *pvStack_1e48;
  char *pcStack_1e40;
  void *pvStack_1e38;
  char *pcStack_1e30;
  undefined8 uStack_1e28;
  char *pcStack_1e20;
  void *pvStack_1e18;
  char *pcStack_1e10;
  undefined8 uStack_1e08;
  char acStack_1e00 [4];
  uint uStack_1dfc;
  undefined1 auStack_1d38 [648];
  undefined **ppuStack_1ab0;
  char *pcStack_1aa8;
  long lStack_1aa0;
  undefined1 *puStack_1a98;
  undefined1 *puStack_1a90;
  code *pcStack_1a88;
  int iStack_1a80;
  int iStack_1a7c;
  char acStack_1a78 [504];
  undefined1 auStack_1880 [168];
  undefined8 uStack_17d8;
  long lStack_17d0;
  undefined8 uStack_17c8;
  undefined8 uStack_17c0;
  char *pcStack_17b8;
  char *pcStack_17b0;
  char *pcStack_17a8;
  char *pcStack_17a0;
  char *pcStack_1798;
  long lStack_1790;
  undefined8 uStack_1788;
  char *pcStack_1780;
  char *pcStack_1778;
  char *pcStack_1770;
  char *pcStack_1768;
  long lStack_1760;
  char *pcStack_1758;
  char *pcStack_1750;
  char *pcStack_1748;
  char *pcStack_1740;
  char *pcStack_1738;
  char *pcStack_1730;
  char *pcStack_1728;
  char *pcStack_1720;
  char *pcStack_1718;
  char *pcStack_1710;
  code *apcStack_1708 [12];
  undefined8 uStack_16a8;
  char *pcStack_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 uStack_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 uStack_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 uStack_1640;
  undefined8 uStack_1638;
  char *apcStack_1630 [22];
  char acStack_1580 [4];
  uint uStack_157c;
  undefined1 auStack_14b8 [648];
  char *pcStack_1230;
  undefined **ppuStack_1228;
  char **ppcStack_1220;
  char *pcStack_1218;
  char *pcStack_1210;
  code *pcStack_1208;
  undefined1 auStack_1200 [128];
  undefined1 auStack_1180 [240];
  undefined1 auStack_1090 [648];
  code *pcStack_e08;
  undefined1 auStack_e00 [128];
  char acStack_d80 [232];
  int iStack_c98;
  int iStack_c94;
  char acStack_c90 [632];
  char *pcStack_a18;
  code *apcStack_a10 [2];
  int iStack_a00;
  int iStack_9fc;
  undefined8 uStack_828;
  char *pcStack_820;
  undefined8 uStack_818;
  int *piStack_810;
  code *pcStack_808;
  int iStack_784;
  char acStack_780 [184];
  undefined8 uStack_6c8;
  char *pcStack_6c0;
  char acStack_6b4 [12];
  undefined1 auStack_6a8 [648];
  char *pcStack_420;
  char *pcStack_418;
  int *piStack_410;
  code *apcStack_408 [15];
  int local_390;
  int local_38c;
  char *local_388;
  char local_380 [200];
  undefined1 local_2b8 [648];
  
  pcVar18 = "{\"x\": {\"$binary\": \"Zm9v\", \"$type\": \"05\"}}";
  ppuVar21 = &PTR_anon_var_dwarf_1a702_00163258;
  pcVar26 = "foo";
  while( true ) {
    apcStack_408[0] = (code *)0x131541;
    cVar1 = bson_init_from_json(local_380,pcVar18,0xffffffffffffffff,local_2b8);
    if (cVar1 == '\0') break;
    apcStack_408[0] = (code *)0x13154e;
    uVar5 = bson_bcone_magic();
    apcStack_408[0] = (code *)0x0;
    piStack_410 = &local_390;
    pcStack_418 = (char *)0x131578;
    bcon_extract(local_380,"x",uVar5,4,&local_38c,&local_388);
    if (local_38c != 5) {
LAB_001315d4:
      apcStack_408[0] = (code *)0x1315d9;
      test_bson_json_read_legacy_binary_cold_2();
      break;
    }
    if (local_390 != 3) {
      apcStack_408[0] = (code *)0x1315d4;
      test_bson_json_read_legacy_binary_cold_3();
      goto LAB_001315d4;
    }
    unaff_R15 = local_388;
    if (local_388 != "foo") {
      apcStack_408[0] = (code *)0x1315a3;
      iVar2 = strcmp(local_388,"foo");
      if (iVar2 == 0) goto LAB_001315a7;
      goto LAB_001315e6;
    }
LAB_001315a7:
    apcStack_408[0] = (code *)0x1315af;
    bson_destroy(local_380);
    pcVar18 = *ppuVar21;
    ppuVar21 = ppuVar21 + 1;
    if (pcVar18 == (char *)0x0) {
      return;
    }
  }
  apcStack_408[0] = (code *)0x1315e6;
  test_bson_json_read_legacy_binary_cold_1();
LAB_001315e6:
  apcStack_408[0] = test_json_reader_new_from_file;
  test_bson_json_read_legacy_binary_cold_4();
  pcStack_418 = "foo";
  acStack_780[0x70] = '\0';
  acStack_780[0x71] = '\0';
  acStack_780[0x72] = '\0';
  acStack_780[0x73] = '\0';
  acStack_780[0x74] = '\0';
  acStack_780[0x75] = '\0';
  acStack_780[0x76] = '\0';
  acStack_780[0x77] = '\0';
  acStack_780[0x78] = '\0';
  acStack_780[0x79] = '\0';
  acStack_780[0x7a] = '\0';
  acStack_780[0x7b] = '\0';
  acStack_780[0x7c] = '\0';
  acStack_780[0x7d] = '\0';
  acStack_780[0x7e] = '\0';
  acStack_780[0x7f] = '\0';
  acStack_780[0x60] = '\0';
  acStack_780[0x61] = '\0';
  acStack_780[0x62] = '\0';
  acStack_780[99] = '\0';
  acStack_780[100] = '\0';
  acStack_780[0x65] = '\0';
  acStack_780[0x66] = '\0';
  acStack_780[0x67] = '\0';
  acStack_780[0x68] = '\0';
  acStack_780[0x69] = '\0';
  acStack_780[0x6a] = '\0';
  acStack_780[0x6b] = '\0';
  acStack_780[0x6c] = '\0';
  acStack_780[0x6d] = '\0';
  acStack_780[0x6e] = '\0';
  acStack_780[0x6f] = '\0';
  acStack_780[0x50] = '\0';
  acStack_780[0x51] = '\0';
  acStack_780[0x52] = '\0';
  acStack_780[0x53] = '\0';
  acStack_780[0x54] = '\0';
  acStack_780[0x55] = '\0';
  acStack_780[0x56] = '\0';
  acStack_780[0x57] = '\0';
  acStack_780[0x58] = '\0';
  acStack_780[0x59] = '\0';
  acStack_780[0x5a] = '\0';
  acStack_780[0x5b] = '\0';
  acStack_780[0x5c] = '\0';
  acStack_780[0x5d] = '\0';
  acStack_780[0x5e] = '\0';
  acStack_780[0x5f] = '\0';
  acStack_780[0x40] = '\0';
  acStack_780[0x41] = '\0';
  acStack_780[0x42] = '\0';
  acStack_780[0x43] = '\0';
  acStack_780[0x44] = '\0';
  acStack_780[0x45] = '\0';
  acStack_780[0x46] = '\0';
  acStack_780[0x47] = '\0';
  acStack_780[0x48] = '\0';
  acStack_780[0x49] = '\0';
  acStack_780[0x4a] = '\0';
  acStack_780[0x4b] = '\0';
  acStack_780[0x4c] = '\0';
  acStack_780[0x4d] = '\0';
  acStack_780[0x4e] = '\0';
  acStack_780[0x4f] = '\0';
  acStack_780[0x30] = '\0';
  acStack_780[0x31] = '\0';
  acStack_780[0x32] = '\0';
  acStack_780[0x33] = '\0';
  acStack_780[0x34] = '\0';
  acStack_780[0x35] = '\0';
  acStack_780[0x36] = '\0';
  acStack_780[0x37] = '\0';
  acStack_780[0x38] = '\0';
  acStack_780[0x39] = '\0';
  acStack_780[0x3a] = '\0';
  acStack_780[0x3b] = '\0';
  acStack_780[0x3c] = '\0';
  acStack_780[0x3d] = '\0';
  acStack_780[0x3e] = '\0';
  acStack_780[0x3f] = '\0';
  acStack_780[0x20] = '\0';
  acStack_780[0x21] = '\0';
  acStack_780[0x22] = '\0';
  acStack_780[0x23] = '\0';
  acStack_780[0x24] = '\0';
  acStack_780[0x25] = '\0';
  acStack_780[0x26] = '\0';
  acStack_780[0x27] = '\0';
  acStack_780[0x28] = '\0';
  acStack_780[0x29] = '\0';
  acStack_780[0x2a] = '\0';
  acStack_780[0x2b] = '\0';
  acStack_780[0x2c] = '\0';
  acStack_780[0x2d] = '\0';
  acStack_780[0x2e] = '\0';
  acStack_780[0x2f] = '\0';
  acStack_780[0x10] = '\0';
  acStack_780[0x11] = '\0';
  acStack_780[0x12] = '\0';
  acStack_780[0x13] = '\0';
  acStack_780[0x14] = '\0';
  acStack_780[0x15] = '\0';
  acStack_780[0x16] = '\0';
  acStack_780[0x17] = '\0';
  acStack_780[0x18] = '\0';
  acStack_780[0x19] = '\0';
  acStack_780[0x1a] = '\0';
  acStack_780[0x1b] = '\0';
  acStack_780[0x1c] = '\0';
  acStack_780[0x1d] = '\0';
  acStack_780[0x1e] = '\0';
  acStack_780[0x1f] = '\0';
  acStack_780[0] = '\x03';
  acStack_780[1] = '\0';
  acStack_780[2] = '\0';
  acStack_780[3] = '\0';
  acStack_780[4] = '\x05';
  acStack_780[5] = '\0';
  acStack_780[6] = '\0';
  acStack_780[7] = '\0';
  acStack_780[8] = '\x05';
  acStack_780[9] = '\0';
  acStack_780[10] = '\0';
  acStack_780[0xb] = '\0';
  acStack_780[0xc] = '\0';
  acStack_780[0xd] = '\0';
  acStack_780[0xe] = '\0';
  acStack_780[0xf] = '\0';
  pcStack_808 = (code *)0x131673;
  pcStack_420 = local_380;
  apcStack_408[0] = (code *)&stack0xfffffffffffffff8;
  pcVar18 = (char *)bson_json_reader_new_from_file
                              ("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/json/test.json"
                               ,auStack_6a8);
  if (pcVar18 == (char *)0x0) {
    pcStack_808 = (code *)0x1317bc;
    test_json_reader_new_from_file_cold_6();
    pcVar18 = local_380;
LAB_001317bc:
    pcStack_808 = (code *)0x1317c1;
    test_json_reader_new_from_file_cold_5();
LAB_001317c1:
    pcStack_808 = (code *)0x1317d9;
    test_json_reader_new_from_file_cold_1();
LAB_001317d9:
    pcStack_808 = (code *)0x1317de;
    test_json_reader_new_from_file_cold_3();
LAB_001317de:
    pcStack_808 = (code *)0x1317f6;
    test_json_reader_new_from_file_cold_4();
  }
  else {
    pcStack_808 = (code *)0x131697;
    iVar2 = bson_json_reader_read(pcVar18,acStack_780,auStack_6a8);
    if (iVar2 != 1) goto LAB_001317c1;
    pcStack_808 = (code *)0x1316a5;
    pcVar26 = (char *)bson_bcone_magic();
    piStack_810 = &iStack_784;
    pcStack_808 = (code *)0x0;
    uStack_818 = 0xf;
    uStack_828 = 0x1316e2;
    pcStack_820 = pcVar26;
    bcon_extract(acStack_780,"foo",pcVar26,0,&pcStack_6c0,"a");
    unaff_R15 = pcStack_6c0;
    if (pcStack_6c0 == "bar") {
LAB_0013170c:
      if (iStack_784 != 1) goto LAB_001317d9;
      unaff_R15 = acStack_780;
      pcStack_808 = (code *)0x131729;
      bson_reinit(unaff_R15);
      pcStack_808 = (code *)0x13173c;
      iVar2 = bson_json_reader_read(pcVar18,unaff_R15,auStack_6a8);
      if (iVar2 == 1) {
        unaff_R15 = (char *)&uStack_6c8;
        pcStack_808 = (code *)0x131771;
        bcon_extract(acStack_780,"_id",pcVar26,6,unaff_R15,0);
        pcVar26 = acStack_6b4;
        pcStack_808 = (code *)0x131788;
        bson_oid_init_from_string(pcVar26,"aabbccddeeff001122334455");
        pcStack_808 = (code *)0x131793;
        cVar1 = bson_oid_equal(pcVar26,uStack_6c8);
        if (cVar1 != '\0') {
          pcStack_808 = (code *)0x1317a4;
          bson_destroy(acStack_780);
          pcStack_808 = (code *)0x1317ac;
          bson_json_reader_destroy(pcVar18);
          return;
        }
        goto LAB_001317bc;
      }
      goto LAB_001317de;
    }
    pcStack_808 = (code *)0x131704;
    iVar2 = strcmp("bar",pcStack_6c0);
    if (iVar2 == 0) goto LAB_0013170c;
  }
  pcStack_808 = test_json_reader_new_from_bad_path;
  test_json_reader_new_from_file_cold_2();
  apcStack_a10[0] = (code *)0x131816;
  lVar6 = bson_json_reader_new_from_file
                    ("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/json/does-not-exist"
                     ,&iStack_a00);
  if (lVar6 == 0) {
    if (iStack_a00 != 2) goto LAB_0013183a;
    if (iStack_9fc == 1) {
      return;
    }
  }
  else {
    apcStack_a10[0] = (code *)0x13183a;
    test_json_reader_new_from_bad_path_cold_1();
LAB_0013183a:
    apcStack_a10[0] = (code *)0x13183f;
    test_json_reader_new_from_bad_path_cold_2();
  }
  apcStack_a10[0] = test_bson_json_number_long;
  test_json_reader_new_from_bad_path_cold_3();
  pcStack_e08 = (code *)0x131877;
  pcStack_a18 = pcVar18;
  apcStack_a10[0] = (code *)apcStack_408;
  cVar1 = bson_init_from_json(acStack_d80,"{\"key\": {\"$numberLong\": \"4611686018427387904\"}}",
                              0xffffffffffffffff,&iStack_c98);
  if (cVar1 == '\0') {
LAB_00131c0c:
    pcStack_e08 = (code *)0x131c19;
    test_bson_json_number_long_cold_1();
LAB_00131c19:
    pcStack_e08 = (code *)0x131c26;
    test_bson_json_number_long_cold_6();
LAB_00131c26:
    pcStack_e08 = (code *)0x131c2e;
    test_bson_json_number_long_cold_9();
LAB_00131c2e:
    pcStack_e08 = (code *)0x131c3b;
    test_bson_json_number_long_cold_10();
LAB_00131c3b:
    pcStack_e08 = (code *)0x131c43;
    test_bson_json_number_long_cold_13();
LAB_00131c43:
    pcStack_e08 = (code *)0x131c48;
    test_bson_json_number_long_cold_14();
LAB_00131c48:
    pcStack_e08 = (code *)0x131c4d;
    test_bson_json_number_long_cold_15();
LAB_00131c4d:
    pcStack_e08 = (code *)0x131c55;
    test_bson_json_number_long_cold_28();
LAB_00131c55:
    pcStack_e08 = (code *)0x131c5a;
    test_bson_json_number_long_cold_16();
LAB_00131c5a:
    pcStack_e08 = (code *)0x131c5f;
    test_bson_json_number_long_cold_17();
LAB_00131c5f:
    pcStack_e08 = (code *)0x131c67;
    test_bson_json_number_long_cold_26();
LAB_00131c67:
    pcStack_e08 = (code *)0x131c6c;
    test_bson_json_number_long_cold_18();
LAB_00131c6c:
    pcStack_e08 = (code *)0x131c71;
    test_bson_json_number_long_cold_19();
LAB_00131c71:
    pcStack_e08 = (code *)0x131c79;
    test_bson_json_number_long_cold_24();
LAB_00131c79:
    pcStack_e08 = (code *)0x131c7e;
    test_bson_json_number_long_cold_20();
LAB_00131c7e:
    pcStack_e08 = (code *)0x131c83;
    test_bson_json_number_long_cold_21();
  }
  else {
    pcStack_e08 = (code *)0x13188f;
    cVar1 = bson_iter_init(auStack_e00,acStack_d80);
    if (cVar1 == '\0') {
      pcStack_e08 = (code *)0x131bcb;
      test_bson_json_number_long_cold_2();
LAB_00131bcb:
      pcStack_e08 = (code *)0x131bd0;
      test_bson_json_number_long_cold_3();
LAB_00131bd0:
      pcStack_e08 = (code *)0x131bd5;
      test_bson_json_number_long_cold_4();
LAB_00131bd5:
      pcStack_e08 = (code *)0x131bda;
      test_bson_json_number_long_cold_5();
LAB_00131bda:
      pcStack_e08 = (code *)0x131bdf;
      test_bson_json_number_long_cold_31();
LAB_00131bdf:
      pcStack_e08 = (code *)0x131be4;
      test_bson_json_number_long_cold_30();
LAB_00131be4:
      pcStack_e08 = (code *)0x131be9;
      test_bson_json_number_long_cold_7();
LAB_00131be9:
      pcStack_e08 = (code *)0x131bee;
      test_bson_json_number_long_cold_8();
LAB_00131bee:
      pcStack_e08 = (code *)0x131bf3;
      test_bson_json_number_long_cold_11();
LAB_00131bf3:
      pcStack_e08 = (code *)0x131bf8;
      test_bson_json_number_long_cold_12();
LAB_00131bf8:
      pcStack_e08 = (code *)0x131bfd;
      test_bson_json_number_long_cold_29();
LAB_00131bfd:
      pcStack_e08 = (code *)0x131c02;
      test_bson_json_number_long_cold_27();
LAB_00131c02:
      pcStack_e08 = (code *)0x131c07;
      test_bson_json_number_long_cold_25();
LAB_00131c07:
      pcStack_e08 = (code *)0x131c0c;
      test_bson_json_number_long_cold_23();
      goto LAB_00131c0c;
    }
    pcStack_e08 = (code *)0x1318a6;
    cVar1 = bson_iter_find(auStack_e00,"key");
    if (cVar1 == '\0') goto LAB_00131bcb;
    pcStack_e08 = (code *)0x1318b6;
    iVar2 = bson_iter_type(auStack_e00);
    if (iVar2 != 0x12) goto LAB_00131bd0;
    pcStack_e08 = (code *)0x1318c7;
    lVar6 = bson_iter_int64(auStack_e00);
    if (lVar6 != 0x4000000000000000) goto LAB_00131bd5;
    pcVar18 = acStack_d80;
    pcStack_e08 = (code *)0x1318ea;
    bson_destroy(pcVar18);
    pcStack_e08 = (code *)0x131908;
    cVar1 = bson_init_from_json(pcVar18,"{\"key\": {\"$numberLong\": \"461168601abcd\"}}",
                                0xffffffffffffffff,&iStack_c98);
    if (cVar1 != '\0') goto LAB_00131bda;
    pcStack_e08 = (code *)0x131933;
    cVar1 = bson_init_from_json(acStack_d80,"{\"key\": {\"$numberLong\": \"461168601abcd\"}}",
                                0xffffffffffffffff,&iStack_c98);
    if (cVar1 != '\0') goto LAB_00131bdf;
    pcStack_e08 = (code *)0x13195e;
    cVar1 = bson_init_from_json(acStack_d80,"{\"x\": {\"$numberLong\": \"9223372036854775807\"}}",
                                0xffffffffffffffff,&iStack_c98);
    if (cVar1 == '\0') goto LAB_00131c19;
    pcStack_e08 = (code *)0x13197d;
    cVar1 = bson_iter_init_find(auStack_e00,acStack_d80,"x");
    if (cVar1 == '\0') goto LAB_00131be4;
    pcStack_e08 = (code *)0x13198d;
    iVar2 = bson_iter_type(auStack_e00);
    if (iVar2 != 0x12) goto LAB_00131be9;
    pcVar18 = (char *)0x7fffffffffffffff;
    pcStack_e08 = (code *)0x1319a8;
    lVar6 = bson_iter_int64(auStack_e00);
    if (lVar6 != 0x7fffffffffffffff) goto LAB_00131c26;
    pcStack_e08 = (code *)0x1319d4;
    cVar1 = bson_init_from_json(acStack_d80,"{\"x\": {\"$numberLong\": \"-9223372036854775808\"}}",
                                0xffffffffffffffff,&iStack_c98);
    if (cVar1 == '\0') goto LAB_00131c2e;
    pcStack_e08 = (code *)0x1319f3;
    cVar1 = bson_iter_init_find(auStack_e00,acStack_d80,"x");
    if (cVar1 == '\0') goto LAB_00131bee;
    pcStack_e08 = (code *)0x131a03;
    iVar2 = bson_iter_type(auStack_e00);
    if (iVar2 != 0x12) goto LAB_00131bf3;
    pcStack_e08 = (code *)0x131a14;
    lVar6 = bson_iter_int64(auStack_e00);
    pcVar18 = (char *)0x8000000000000000;
    if (lVar6 != -0x8000000000000000) goto LAB_00131c3b;
    pcVar18 = acStack_d80;
    pcStack_e08 = (code *)0x131a30;
    bson_destroy(pcVar18);
    pcStack_e08 = (code *)0x131a4e;
    cVar1 = bson_init_from_json(pcVar18,"{\"x\": {\"$numberLong\": \"9223372036854775808\"}}",
                                0xffffffffffffffff,&iStack_c98);
    if (cVar1 != '\0') goto LAB_00131bf8;
    if (iStack_c98 != 1) goto LAB_00131c43;
    if (iStack_c94 != 2) goto LAB_00131c48;
    pcVar18 = acStack_c90;
    pcStack_e08 = (code *)0x131a8d;
    pcVar7 = strstr(pcVar18,"Number \"9223372036854775808\" is out of range");
    if (pcVar7 == (char *)0x0) goto LAB_00131c4d;
    pcStack_e08 = (code *)0x131ab9;
    cVar1 = bson_init_from_json(acStack_d80,"{\"x\": {\"$numberLong\": \"-9223372036854775809\"}}",
                                0xffffffffffffffff,&iStack_c98);
    if (cVar1 != '\0') goto LAB_00131bfd;
    if (iStack_c98 != 1) goto LAB_00131c55;
    if (iStack_c94 != 2) goto LAB_00131c5a;
    pcStack_e08 = (code *)0x131af0;
    pcVar7 = strstr(pcVar18,"Number \"-9223372036854775809\" is out of range");
    if (pcVar7 == (char *)0x0) goto LAB_00131c5f;
    pcStack_e08 = (code *)0x131b1c;
    cVar1 = bson_init_from_json(acStack_d80,"{\"x\": {\"$numberLong\": \"10000000000000000000\"}}",
                                0xffffffffffffffff,&iStack_c98);
    if (cVar1 != '\0') goto LAB_00131c02;
    if (iStack_c98 != 1) goto LAB_00131c67;
    if (iStack_c94 != 2) goto LAB_00131c6c;
    pcStack_e08 = (code *)0x131b53;
    pcVar7 = strstr(pcVar18,"Number \"10000000000000000000\" is out of range");
    if (pcVar7 == (char *)0x0) goto LAB_00131c71;
    pcStack_e08 = (code *)0x131b7f;
    cVar1 = bson_init_from_json(acStack_d80,"{\"x\": -10000000000000000000}",0xffffffffffffffff,
                                &iStack_c98);
    if (cVar1 != '\0') goto LAB_00131c07;
    if (iStack_c98 != 1) goto LAB_00131c79;
    if (iStack_c94 != 2) goto LAB_00131c7e;
    pcStack_e08 = (code *)0x131bb6;
    pcVar7 = strstr(pcVar18,"Number \"-10000000000000000000\" is out of range");
    if (pcVar7 != (char *)0x0) {
      return;
    }
  }
  pcStack_e08 = test_bson_json_number_long_zero;
  test_bson_json_number_long_cold_22();
  pcStack_1208 = (code *)0x131cbd;
  pcStack_e08 = (code *)apcStack_a10;
  cVar1 = bson_init_from_json(auStack_1180,"{ \"key\": { \"$numberLong\": \"0\" }}",
                              0xffffffffffffffff,auStack_1090);
  if (cVar1 != '\0') {
    pcStack_1208 = (code *)0x131cd1;
    cVar1 = bson_iter_init(auStack_1200,auStack_1180);
    if (cVar1 == '\0') {
      pcStack_1208 = (code *)0x131d19;
      test_bson_json_number_long_zero_cold_2();
LAB_00131d19:
      pcStack_1208 = (code *)0x131d1e;
      test_bson_json_number_long_zero_cold_3();
LAB_00131d1e:
      pcStack_1208 = (code *)0x131d23;
      test_bson_json_number_long_zero_cold_4();
    }
    else {
      pcStack_1208 = (code *)0x131ce4;
      cVar1 = bson_iter_find(auStack_1200,"key");
      if (cVar1 == '\0') goto LAB_00131d19;
      pcStack_1208 = (code *)0x131cf0;
      iVar2 = bson_iter_type(auStack_1200);
      if (iVar2 != 0x12) goto LAB_00131d1e;
      pcStack_1208 = (code *)0x131cfd;
      lVar6 = bson_iter_int64(auStack_1200);
      if (lVar6 == 0) {
        pcStack_1208 = (code *)0x131d0f;
        bson_destroy(auStack_1180);
        return;
      }
    }
    pcStack_1208 = (code *)0x131d28;
    test_bson_json_number_long_zero_cold_5();
  }
  pcStack_1208 = test_bson_json_code;
  test_bson_json_number_long_zero_cold_1();
  apcStack_1708[0] = (code *)0x131d52;
  pcStack_1230 = pcVar18;
  ppuStack_1228 = ppuVar21;
  ppcStack_1220 = &local_388;
  pcStack_1218 = pcVar26;
  pcStack_1210 = unaff_R15;
  pcStack_1208 = (code *)&pcStack_e08;
  lVar6 = bson_bcon_magic();
  apcStack_1708[0] = (code *)0x131d7d;
  pcStack_16a0 = (char *)bcon_new(0,"a",lVar6,0xc,"b",0);
  apcStack_1708[0] = (code *)0x131da0;
  uStack_16a8 = bcon_new(0,"a",lVar6,0xc,"b",0);
  apcStack_1708[0] = (code *)0x131dc6;
  uVar5 = bcon_new(0,"var",lVar6,0xf,1,0);
  pcStack_1710 = (char *)0x0;
  pcStack_1718 = (char *)0x131dec;
  uStack_1638 = bcon_new(0,"a",lVar6,0xe,"b",uVar5);
  apcStack_1708[0] = (code *)0x131e19;
  uVar8 = bcon_new(0,"var2",lVar6,0x11,2,0);
  pcStack_1710 = (char *)0x0;
  pcStack_1718 = (char *)0x131e3f;
  uStack_1640 = bcon_new(0,"a",lVar6,0xe,"b",uVar8);
  apcStack_1708[0] = (code *)0x0;
  pcStack_1718 = "d";
  pcStack_1720 = (char *)0xe;
  pcStack_1730 = "c";
  pcStack_1738 = (char *)0x131e89;
  pcStack_1728 = (char *)lVar6;
  pcStack_1710 = (char *)uVar8;
  uStack_1678 = uVar8;
  uStack_1648 = bcon_new(0,"a",lVar6,0xe,"b",uVar5);
  pcStack_1710 = (char *)0x0;
  pcStack_1718 = "}";
  pcStack_1720 = "}";
  pcStack_1728 = "value2";
  pcStack_1730 = (char *)0x0;
  pcStack_1740 = "key2";
  pcStack_1748 = "{";
  pcStack_1750 = "subdoc";
  pcStack_1758 = "value";
  lStack_1760 = 0;
  pcStack_1770 = "key1";
  pcStack_1778 = "{";
  pcStack_1780 = "c";
  uStack_1788 = 0x131f0d;
  pcStack_1768 = (char *)lVar6;
  pcStack_1738 = (char *)lVar6;
  uStack_1650 = bcon_new(0,"a",lVar6,0xe,"b",uVar5);
  pcStack_1710 = (char *)0x0;
  pcStack_1718 = (char *)0x131f51;
  uStack_1670 = uVar5;
  uStack_1658 = bcon_new(0,"a",lVar6,0xe,"b",uVar5);
  apcStack_1708[0] = (code *)0x131f7a;
  uStack_1680 = bcon_new(0,"var","{","}",0);
  pcStack_1710 = (char *)0x0;
  pcStack_1718 = (char *)0x131fa2;
  uStack_1660 = bcon_new(0,"a",lVar6,0xe,"b",uStack_1680);
  apcStack_1708[0] = (code *)0x0;
  pcStack_1710 = "}";
  pcStack_1718 = "}";
  pcStack_1720 = (char *)0x3;
  pcStack_1728 = (char *)0xf;
  pcStack_1738 = "z";
  pcStack_1740 = "{";
  pcStack_1748 = "d3";
  pcStack_1750 = (char *)0x1;
  pcStack_1758 = (char *)0xf;
  pcStack_1768 = "x";
  pcStack_1770 = "{";
  pcStack_1778 = "d2";
  pcStack_1780 = (char *)0x1;
  uStack_1788 = 0x11;
  pcStack_1798 = "n";
  pcStack_17a0 = "}";
  pcStack_17a8 = "{";
  pcStack_17b0 = "d";
  pcStack_17b8 = "]";
  uStack_17c0 = 2;
  uStack_17c8 = 0xf;
  uStack_17d8 = 0x132050;
  lStack_17d0 = lVar6;
  lStack_1790 = lVar6;
  lStack_1760 = lVar6;
  pcStack_1730 = (char *)lVar6;
  uStack_1688 = bcon_new(0,"arr","[",lVar6,0xf,1);
  pcStack_1710 = (char *)0x0;
  pcStack_1718 = (char *)0x13208c;
  uStack_1668 = bcon_new(0,"a",lVar6,0xe,"b",uStack_1688);
  apcStack_1708[0] = (code *)0x13209d;
  uStack_1690 = bson_new();
  pcStack_1710 = (char *)0x0;
  pcStack_1718 = (char *)0x1320c5;
  pcVar18 = (char *)bcon_new(0,"a",lVar6,0xe,"b",uStack_1690);
  pcStack_1710 = (char *)0x0;
  pcStack_1718 = "}";
  pcStack_1720 = "c";
  pcStack_1728 = (char *)0x132108;
  uStack_1698 = bcon_new(0,"x","{","$code",lVar6,0);
  pcStack_1710 = (char *)0x0;
  pcStack_1718 = (char *)0x13212d;
  apcStack_1630[0x15] = (char *)bcon_new(0,"a",lVar6,0xe,"b",uStack_1698);
  apcStack_1630[0] = "{\"a\": {\"$code\": \"b\"}}";
  apcStack_1630[1] = pcStack_16a0;
  apcStack_1630[2] = "{\"a\": {\"$code\": \"b\\u0000c\\u0000\"}}";
  apcStack_1630[3] = (char *)uStack_16a8;
  apcStack_1630[4] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}}";
  apcStack_1630[5] = (char *)uStack_1638;
  apcStack_1630[6] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var2\": {\"$numberLong\": \"2\"}}}}";
  apcStack_1630[7] = (char *)uStack_1640;
  apcStack_1630[8] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}, \"c\": {\"key1\": \"value\",          \"subdoc\": {\"key2\": \"value2\"}}}"
  ;
  apcStack_1630[9] = (char *)uStack_1650;
  apcStack_1630[10] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}, \"c\": {\"$code\": \"d\",          \"$scope\": {\"var2\": {\"$numberLong\": \"2\"}}}}"
  ;
  apcStack_1630[0xb] = (char *)uStack_1648;
  apcStack_1630[0xc] = "{\"a\": {\"$scope\": {\"var\": 1},          \"$code\": \"b\"}}";
  apcStack_1630[0xd] = (char *)uStack_1658;
  apcStack_1630[0xe] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": {}}}}";
  apcStack_1630[0xf] = (char *)uStack_1660;
  apcStack_1630[0x10] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"arr\": [1, 2], \"d\": {},                      \"n\": {\"$numberLong\": \"1\"},                      \"d2\": {\"x\": 1, \"d3\": {\"z\": 3}}}}}"
  ;
  apcStack_1630[0x11] = (char *)uStack_1668;
  apcStack_1630[0x12] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {}}}";
  apcStack_1630[0x13] = pcVar18;
  apcStack_1630[0x14] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"x\": {\"$code\": \"c\"}}}}";
  pcVar22 = (char *)0x8;
  pcVar26 = acStack_1580;
  pcVar7 = "b";
  while( true ) {
    apcStack_1708[0] = (code *)0x13229d;
    cVar1 = bson_init_from_json(pcVar26,*(undefined8 *)((long)&uStack_1638 + (long)pcVar22),
                                0xffffffffffffffff,auStack_14b8);
    __needle = pcVar22;
    if (cVar1 == '\0') break;
    apcStack_1708[0] = (code *)0x1322b0;
    pcStack_16a0 = (char *)bson_get_data(pcVar26);
    lVar6 = *(long *)((long)apcStack_1630 + (long)pcVar22);
    apcStack_1708[0] = (code *)0x1322c5;
    __needle = (char *)bson_get_data(lVar6);
    if (*(uint *)(lVar6 + 4) != uStack_157c) {
LAB_00132392:
      pcVar26 = acStack_1580;
      apcStack_1708[0] = (code *)0x1323a4;
      pcVar7 = (char *)bson_as_canonical_extended_json(pcVar26);
      apcStack_1708[0] = (code *)0x1323b1;
      uVar5 = bson_as_canonical_extended_json(lVar6);
      pcVar18 = pcStack_16a0;
      uVar3 = *(uint *)(lVar6 + 4);
      if (uStack_157c == 0) goto LAB_001323e2;
      uVar19 = 0;
      goto LAB_001323c8;
    }
    apcStack_1708[0] = (code *)0x1322e1;
    pvVar9 = (void *)bson_get_data(lVar6);
    apcStack_1708[0] = (code *)0x1322ec;
    pvVar10 = (void *)bson_get_data(pcVar26);
    apcStack_1708[0] = (code *)0x1322fb;
    iVar2 = bcmp(pvVar9,pvVar10,(ulong)*(uint *)(lVar6 + 4));
    if (iVar2 != 0) goto LAB_00132392;
    apcStack_1708[0] = (code *)0x13230e;
    bson_destroy(pcVar26);
    pcVar22 = pcVar22 + 0x10;
    pcVar7 = pcVar26;
    pcVar18 = __needle;
    if (pcVar22 == (char *)0xb8) {
      lVar6 = 8;
      do {
        apcStack_1708[0] = (code *)0x132331;
        bson_destroy(*(undefined8 *)((long)apcStack_1630 + lVar6));
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0xb8);
      apcStack_1708[0] = (code *)0x13234b;
      bson_destroy(uStack_1670);
      apcStack_1708[0] = (code *)0x132358;
      bson_destroy(uStack_1678);
      apcStack_1708[0] = (code *)0x132365;
      bson_destroy(uStack_1680);
      apcStack_1708[0] = (code *)0x13236f;
      bson_destroy(uStack_1688);
      apcStack_1708[0] = (code *)0x132379;
      bson_destroy(uStack_1698);
      apcStack_1708[0] = (code *)0x132383;
      bson_destroy(uStack_1690);
      return;
    }
  }
LAB_001324a3:
  apcStack_1708[0] = test_bson_json_code_errors;
  test_bson_json_code_cold_1();
  lVar24 = 8;
  pcStack_1730 = pcVar7;
  pcStack_1728 = __needle;
  pcStack_1720 = pcVar18;
  pcStack_1718 = pcVar26;
  pcStack_1710 = (char *)lVar6;
  apcStack_1708[0] = (code *)&pcStack_1208;
  do {
    pcStack_1a88 = (code *)0x1324f7;
    cVar1 = bson_init_from_json(auStack_1880,*(undefined8 *)(&UNK_00163268 + lVar24),
                                0xffffffffffffffff,&iStack_1a80);
    if (cVar1 != '\0') {
      pcStack_1a88 = (code *)0x132544;
      test_bson_json_code_errors_cold_3();
LAB_00132544:
      pcStack_1a88 = (code *)0x132549;
      test_bson_json_code_errors_cold_2();
LAB_00132549:
      pcStack_1a88 = (code *)0x132569;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_1a78,
              __needle);
      pcStack_1a88 = (code *)0x13256e;
      abort();
    }
    if (iStack_1a80 != 1) {
      pcStack_1a88 = test_bson_json_dbref;
      test_bson_json_code_errors_cold_1();
      ppuStack_1ab0 = &PTR_anon_var_dwarf_1aa32_00163270;
      apcStack_1e88[0] = (code *)0x132590;
      pcStack_1aa8 = __needle;
      lStack_1aa0 = lVar24;
      puStack_1a98 = auStack_1880;
      puStack_1a90 = (undefined1 *)&iStack_1a80;
      pcStack_1a88 = (code *)apcStack_1708;
      uVar5 = bson_bcon_magic();
      if (oid_zero_initialized == '\0') {
        apcStack_1e88[0] = (code *)0x1325af;
        bson_oid_init_from_string(oid_zero_oid,"000000000000000000000000");
        oid_zero_initialized = '\x01';
      }
      pvVar10 = (void *)0x0;
      pcVar26 = "$ref";
      pcStack_1e90 = (char *)0x0;
      pcStack_1e98 = "}";
      pcStack_1ea0 = oid_zero_oid;
      pcStack_1ea8 = (char *)0x6;
      pcStack_1eb8 = "$id";
      pcStack_1ec0 = "collection";
      pcStack_1ec8 = (char *)0x132610;
      pcStack_1eb0 = (char *)uVar5;
      pvStack_1e48 = (void *)bcon_new(0,"key","{","$ref",uVar5,0);
      pcStack_1e90 = (char *)0x0;
      pcStack_1e98 = "}";
      pcStack_1ea0 = (char *)0x1;
      pcStack_1ea8 = (char *)0xf;
      pcStack_1eb8 = "$id";
      pcStack_1ec0 = "collection";
      pcStack_1ec8 = (char *)0x132660;
      pcStack_1eb0 = (char *)uVar5;
      uStack_1e50 = bcon_new(0,"key","{","$ref",uVar5,0);
      apcStack_1e88[0] = (code *)0x0;
      pcStack_1e90 = "}";
      pcStack_1e98 = "}";
      pcStack_1ea0 = (char *)0x1;
      pcStack_1ea8 = (char *)0xf;
      pcStack_1eb8 = "a";
      pcStack_1ec0 = "{";
      pcStack_1ec8 = "$id";
      pcStack_1ed0 = "collection";
      pcStack_1ed8 = (char *)0x1326b8;
      pcStack_1eb0 = (char *)uVar5;
      pvVar9 = (void *)bcon_new(0,"key","{","$ref",uVar5,0);
      pcStack_1e90 = (char *)0x0;
      pcStack_1e98 = "}";
      pcStack_1ea0 = (char *)0x1;
      pcStack_1ea8 = (char *)0x7;
      pcStack_1eb8 = "meta";
      pcStack_1ec0 = (char *)0x1;
      pcStack_1ec8 = (char *)0xf;
      pcStack_1ed8 = "$id";
      pcStack_1ee0 = "collection";
      uStack_1ee8 = 0x13271b;
      pcStack_1ed0 = (char *)uVar5;
      pcStack_1eb0 = (char *)uVar5;
      uStack_1e08 = bcon_new(0,"key","{","$ref",uVar5,0);
      pcStack_1e40 = 
      "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"$oid\": \"000000000000000000000000\"}}}";
      pvStack_1e38 = pvStack_1e48;
      pcStack_1e30 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1}}";
      uStack_1e28 = uStack_1e50;
      pcStack_1e20 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"a\": 1}}}";
      pvStack_1e18 = pvVar9;
      pcStack_1e10 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1,\"meta\": true}}";
      pcVar18 = "key";
      goto LAB_00132775;
    }
    if (iStack_1a7c != 2) goto LAB_00132544;
    __needle = *(char **)((long)&PTR_anon_var_dwarf_1aa32_00163270 + lVar24);
    pcStack_1a88 = (code *)0x13251e;
    pcVar26 = strstr(acStack_1a78,__needle);
    if (pcVar26 == (char *)0x0) goto LAB_00132549;
    lVar24 = lVar24 + 0x10;
    if (lVar24 == 0x98) {
      return;
    }
  } while( true );
  while( true ) {
    if (pcStack_16a0[uVar19] != __needle[uVar19]) goto LAB_00132488;
    uVar19 = uVar19 + 1;
    if (uStack_157c == (uint)uVar19) break;
LAB_001323c8:
    if (uVar3 == (uint)uVar19) break;
  }
LAB_001323e2:
  uVar4 = uStack_157c;
  if (uStack_157c < uVar3) {
    uVar4 = uVar3;
  }
  uVar19 = (ulong)(uVar4 - 1);
  while( true ) {
    apcStack_1708[0] = (code *)0x132407;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar19,pcVar7,uVar5);
    apcStack_1708[0] = (code *)0x13241f;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar7 = (char *)(ulong)uVar3;
    apcStack_1708[0] = (code *)0x132439;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_16a8 = CONCAT44(uStack_16a8._4_4_,uVar3);
    if (uVar3 == 0xffffffff) break;
    pcVar26 = (char *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00132494;
    pcVar7 = (char *)(ulong)uStack_157c;
    apcStack_1708[0] = (code *)0x132460;
    pcVar22 = (char *)write(uVar3,pcVar18,(size_t)pcVar7);
    if (pcVar22 != pcVar7) goto LAB_00132499;
    pcVar7 = (char *)(ulong)*(uint *)(lVar6 + 4);
    apcStack_1708[0] = (code *)0x132477;
    pcVar22 = (char *)write(uVar4,__needle,(size_t)pcVar7);
    if (pcVar22 != pcVar7) goto LAB_0013249e;
    uVar19 = (ulong)uVar4;
    apcStack_1708[0] = (code *)0x132488;
    test_bson_json_code_cold_4();
    uVar5 = extraout_RAX;
LAB_00132488:
    uVar19 = uVar19 & 0xffffffff;
  }
  apcStack_1708[0] = (code *)0x132494;
  test_bson_json_code_cold_6();
LAB_00132494:
  apcStack_1708[0] = (code *)0x132499;
  test_bson_json_code_cold_5();
LAB_00132499:
  apcStack_1708[0] = (code *)0x13249e;
  test_bson_json_code_cold_2();
LAB_0013249e:
  apcStack_1708[0] = (code *)0x1324a3;
  test_bson_json_code_cold_3();
  goto LAB_001324a3;
LAB_00132775:
  apcStack_1e88[0] = (code *)0x132791;
  cVar1 = bson_init_from_json(acStack_1e00,*(undefined8 *)((long)&pcStack_1e40 + (long)pvVar10),
                              0xffffffffffffffff,auStack_1d38);
  pcVar7 = acStack_1e00;
  pvVar11 = pvVar10;
  if (cVar1 == '\0') goto LAB_0013293d;
  apcStack_1e88[0] = (code *)0x1327a4;
  pvStack_1e48 = (void *)bson_get_data(acStack_1e00);
  pcVar7 = *(char **)((long)&pvStack_1e38 + (long)pvVar10);
  apcStack_1e88[0] = (code *)0x1327b6;
  pvVar11 = (void *)bson_get_data(pcVar7);
  if (*(uint *)(pcVar7 + 4) != uStack_1dfc) {
LAB_0013282b:
    pcVar26 = acStack_1e00;
    apcStack_1e88[0] = (code *)0x13283d;
    pcVar18 = (char *)bson_as_canonical_extended_json(pcVar26);
    apcStack_1e88[0] = (code *)0x13284a;
    uVar5 = bson_as_canonical_extended_json(pcVar7);
    pvVar9 = pvStack_1e48;
    uVar3 = *(uint *)(pcVar7 + 4);
    if (uStack_1dfc == 0) goto LAB_00132879;
    uVar19 = 0;
    goto LAB_00132860;
  }
  apcStack_1e88[0] = (code *)0x1327cd;
  pcVar26 = (char *)bson_get_data(pcVar7);
  apcStack_1e88[0] = (code *)0x1327d8;
  pvVar9 = (void *)bson_get_data(acStack_1e00);
  apcStack_1e88[0] = (code *)0x1327e6;
  iVar2 = bcmp(pcVar26,pvVar9,(ulong)*(uint *)(pcVar7 + 4));
  if (iVar2 != 0) goto LAB_0013282b;
  apcStack_1e88[0] = (code *)0x1327f5;
  bson_destroy(acStack_1e00);
  pvVar10 = (void *)((long)pvVar10 + 0x10);
  pcVar18 = acStack_1e00;
  pvVar9 = pvVar11;
  if (pvVar10 == (void *)0x40) {
    lVar6 = 8;
    do {
      apcStack_1e88[0] = (code *)0x132812;
      bson_destroy(*(undefined8 *)((long)&pcStack_1e40 + lVar6));
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x48);
    return;
  }
  goto LAB_00132775;
  while( true ) {
    if (*(char *)((long)pvStack_1e48 + uVar19) != *(char *)((long)pvVar11 + uVar19))
    goto LAB_00132922;
    uVar19 = uVar19 + 1;
    if (uStack_1dfc == (uint)uVar19) break;
LAB_00132860:
    if (uVar3 == (uint)uVar19) break;
  }
LAB_00132879:
  uVar4 = uStack_1dfc;
  if (uStack_1dfc < uVar3) {
    uVar4 = uVar3;
  }
  uVar19 = (ulong)(uVar4 - 1);
  while( true ) {
    apcStack_1e88[0] = (code *)0x13289e;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar19,pcVar18,uVar5);
    apcStack_1e88[0] = (code *)0x1328b6;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar18 = (char *)(ulong)uVar3;
    apcStack_1e88[0] = (code *)0x1328d1;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_1e50 = CONCAT44(uStack_1e50._4_4_,uVar3);
    if (uVar3 == 0xffffffff) break;
    pcVar26 = (char *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013292e;
    pcVar18 = (char *)(ulong)uStack_1dfc;
    apcStack_1e88[0] = (code *)0x1328fb;
    pcVar22 = (char *)write(uVar3,pvVar9,(size_t)pcVar18);
    if (pcVar22 != pcVar18) goto LAB_00132933;
    pcVar7 = (char *)(ulong)*(uint *)(pcVar7 + 4);
    apcStack_1e88[0] = (code *)0x132911;
    pcVar22 = (char *)write(uVar4,pvVar11,(size_t)pcVar7);
    if (pcVar22 != pcVar7) goto LAB_00132938;
    uVar19 = (ulong)uVar4;
    apcStack_1e88[0] = (code *)0x132922;
    test_bson_json_dbref_cold_4();
    uVar5 = extraout_RAX_00;
LAB_00132922:
    uVar19 = uVar19 & 0xffffffff;
  }
  apcStack_1e88[0] = (code *)0x13292e;
  test_bson_json_dbref_cold_6();
LAB_0013292e:
  apcStack_1e88[0] = (code *)0x132933;
  test_bson_json_dbref_cold_5();
LAB_00132933:
  apcStack_1e88[0] = (code *)0x132938;
  test_bson_json_dbref_cold_2();
LAB_00132938:
  apcStack_1e88[0] = (code *)0x13293d;
  test_bson_json_dbref_cold_3();
LAB_0013293d:
  apcStack_1e88[0] = test_bson_json_uescape;
  test_bson_json_dbref_cold_1();
  pcStack_2288 = (code *)0x132967;
  pcStack_1eb0 = pcVar7;
  pcStack_1ea8 = pcVar18;
  pcStack_1ea0 = pcVar26;
  pcStack_1e98 = (char *)pvVar11;
  pcStack_1e90 = (char *)pvVar9;
  apcStack_1e88[0] = (code *)&pcStack_1a88;
  uVar5 = bson_bcon_magic();
  pcStack_2288 = (code *)0x132989;
  pvStack_2278 = (void *)bcon_new(0,"euro",uVar5,0,anon_var_dwarf_48e4 + 0xc,0);
  pcStack_2288 = (code *)0x1329ad;
  pvVar9 = (void *)bcon_new(0,"crlf",uVar5,0,"\r\n",0);
  pcStack_2288 = (code *)0x1329cf;
  __n = (undefined1 *)bcon_new(0,"quote",uVar5,0,"\"",0);
  pcStack_2288 = (code *)0x1329f1;
  puVar12 = (undefined1 *)bcon_new(0,"backslash",uVar5,0,"\\",0);
  pcStack_2288 = (code *)0x132a0f;
  uVar8 = bcon_new(0,"",uVar5,0,"",0);
  pcStack_2288 = (code *)0x132a31;
  uVar5 = bcon_new(0,"escapes",uVar5,0,"\f\b\t",0);
  pcStack_2288 = (code *)0x132a39;
  uStack_2208 = bson_new();
  pcStack_2270 = "{ \"euro\": \"\\u20AC\"}";
  pvStack_2268 = pvStack_2278;
  pcStack_2260 = "{ \"crlf\": \"\\r\\n\"}";
  pcStack_2250 = "{ \"quote\": \"\\\"\"}";
  pcStack_2240 = "{ \"backslash\": \"\\\\\"}";
  pcStack_2230 = "{ \"\": \"\"}";
  pcStack_2220 = "{ \"escapes\": \"\\f\\b\\t\"}";
  pcStack_2210 = "{ \"nil\": \"\\u0000\"}";
  pcStack_2288 = (code *)0x132ad6;
  pvStack_2258 = pvVar9;
  puStack_2248 = __n;
  puStack_2238 = puVar12;
  uStack_2228 = uVar8;
  uStack_2218 = uVar5;
  bson_append_utf8(uStack_2208,"nil",0xffffffff,"",1);
  pvVar10 = (void *)0x8;
  while( true ) {
    pcStack_2288 = (code *)0x132b00;
    cVar1 = bson_init_from_json(auStack_2200,*(undefined8 *)((long)&pvStack_2278 + (long)pvVar10),
                                0xffffffffffffffff,auStack_2138);
    puVar14 = auStack_2200;
    pvVar11 = pvVar10;
    if (cVar1 == '\0') break;
    pcStack_2288 = (code *)0x132b13;
    pvStack_2278 = (void *)bson_get_data(auStack_2200);
    puVar14 = *(undefined1 **)((long)&pcStack_2270 + (long)pvVar10);
    pcStack_2288 = (code *)0x132b25;
    pvVar11 = (void *)bson_get_data(puVar14);
    if (*(uint *)(puVar14 + 4) != uStack_21fc) {
LAB_00132b9a:
      puVar12 = auStack_2200;
      pcStack_2288 = (code *)0x132bac;
      __n = (undefined1 *)bson_as_canonical_extended_json(puVar12);
      pcStack_2288 = (code *)0x132bb9;
      uVar5 = bson_as_canonical_extended_json(puVar14);
      pvVar9 = pvStack_2278;
      uVar3 = *(uint *)(puVar14 + 4);
      if (uStack_21fc == 0) goto LAB_00132be8;
      uVar19 = 0;
      goto LAB_00132bcf;
    }
    pcStack_2288 = (code *)0x132b3c;
    puVar12 = (undefined1 *)bson_get_data(puVar14);
    pcStack_2288 = (code *)0x132b47;
    pvVar9 = (void *)bson_get_data(auStack_2200);
    pcStack_2288 = (code *)0x132b55;
    iVar2 = bcmp(puVar12,pvVar9,(ulong)*(uint *)(puVar14 + 4));
    if (iVar2 != 0) goto LAB_00132b9a;
    pcStack_2288 = (code *)0x132b64;
    bson_destroy(auStack_2200);
    pvVar10 = (void *)((long)pvVar10 + 0x10);
    __n = auStack_2200;
    pvVar9 = pvVar11;
    if (pvVar10 == (void *)0x78) {
      lVar6 = 8;
      do {
        pcStack_2288 = (code *)0x132b81;
        bson_destroy(*(undefined8 *)((long)&pcStack_2270 + lVar6));
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x78);
      return;
    }
  }
  goto LAB_00132cac;
  while( true ) {
    if (*(char *)((long)pvStack_2278 + uVar19) != *(char *)((long)pvVar11 + uVar19))
    goto LAB_00132c91;
    uVar19 = uVar19 + 1;
    if (uStack_21fc == (uint)uVar19) break;
LAB_00132bcf:
    if (uVar3 == (uint)uVar19) break;
  }
LAB_00132be8:
  uVar4 = uStack_21fc;
  if (uStack_21fc < uVar3) {
    uVar4 = uVar3;
  }
  uVar19 = (ulong)(uVar4 - 1);
  while( true ) {
    pcStack_2288 = (code *)0x132c0d;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar19,__n,uVar5);
    pcStack_2288 = (code *)0x132c25;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    __n = (undefined1 *)(ulong)uVar3;
    pcStack_2288 = (code *)0x132c40;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_227c = uVar3;
    if (uVar3 == 0xffffffff) break;
    puVar12 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00132c9d;
    __n = (undefined1 *)(ulong)uStack_21fc;
    pcStack_2288 = (code *)0x132c6a;
    puVar13 = (undefined1 *)write(uVar3,pvVar9,(size_t)__n);
    if (puVar13 != __n) goto LAB_00132ca2;
    puVar14 = (undefined1 *)(ulong)*(uint *)(puVar14 + 4);
    pcStack_2288 = (code *)0x132c80;
    puVar13 = (undefined1 *)write(uVar4,pvVar11,(size_t)puVar14);
    if (puVar13 != puVar14) goto LAB_00132ca7;
    uVar19 = (ulong)uVar4;
    pcStack_2288 = (code *)0x132c91;
    test_bson_json_uescape_cold_4();
    uVar5 = extraout_RAX_01;
LAB_00132c91:
    uVar19 = uVar19 & 0xffffffff;
  }
  pcStack_2288 = (code *)0x132c9d;
  test_bson_json_uescape_cold_6();
LAB_00132c9d:
  pcStack_2288 = (code *)0x132ca2;
  test_bson_json_uescape_cold_5();
LAB_00132ca2:
  pcStack_2288 = (code *)0x132ca7;
  test_bson_json_uescape_cold_2();
LAB_00132ca7:
  pcStack_2288 = (code *)0x132cac;
  test_bson_json_uescape_cold_3();
LAB_00132cac:
  pcStack_2288 = test_bson_json_uescape_key;
  test_bson_json_uescape_cold_1();
  apcStack_2688[0] = (code *)0x132cd6;
  puStack_22b0 = puVar14;
  puStack_22a8 = __n;
  puStack_22a0 = puVar12;
  pvStack_2298 = pvVar11;
  pvStack_2290 = pvVar9;
  pcStack_2288 = (code *)apcStack_1e88;
  uVar5 = bson_bcon_magic();
  apcStack_2688[0] = (code *)0x132cf5;
  pcVar26 = (char *)bcon_new(0,anon_var_dwarf_48e4 + 0xc,uVar5,0,"euro",0);
  apcStack_2688[0] = (code *)0x132d1b;
  cVar1 = bson_init_from_json(auStack_2600,"{ \"\\u20AC\": \"euro\"}",0xffffffffffffffff,
                              auStack_2538);
  if (cVar1 == '\0') {
    apcStack_2688[0] = (code *)0x132e94;
    test_bson_json_uescape_key_cold_1();
  }
  else {
    apcStack_2688[0] = (code *)0x132d33;
    pvVar9 = (void *)bson_get_data(auStack_2600);
    apcStack_2688[0] = (code *)0x132d3e;
    pvVar11 = (void *)bson_get_data(pcVar26);
    if (*(uint *)(pcVar26 + 4) == uStack_25fc) {
      apcStack_2688[0] = (code *)0x132d53;
      pvVar10 = (void *)bson_get_data(pcVar26);
      apcStack_2688[0] = (code *)0x132d63;
      __s2 = (void *)bson_get_data(auStack_2600);
      apcStack_2688[0] = (code *)0x132d71;
      iVar2 = bcmp(pvVar10,__s2,(ulong)*(uint *)(pcVar26 + 4));
      if (iVar2 == 0) {
        apcStack_2688[0] = (code *)0x132d82;
        bson_destroy(auStack_2600);
        apcStack_2688[0] = (code *)0x132d8a;
        bson_destroy(pcVar26);
        return;
      }
    }
    puVar12 = auStack_2600;
    apcStack_2688[0] = (code *)0x132dab;
    __n = (undefined1 *)bson_as_canonical_extended_json(puVar12);
    apcStack_2688[0] = (code *)0x132db8;
    uVar5 = bson_as_canonical_extended_json(pcVar26);
    uVar3 = *(uint *)(pcVar26 + 4);
    if (uStack_25fc != 0) {
      uVar19 = 0;
      do {
        if (uVar3 == (uint)uVar19) break;
        if (*(char *)((long)pvVar9 + uVar19) != *(char *)((long)pvVar11 + uVar19))
        goto LAB_00132e88;
        uVar19 = uVar19 + 1;
      } while (uStack_25fc != (uint)uVar19);
    }
    uVar4 = uStack_25fc;
    if (uStack_25fc < uVar3) {
      uVar4 = uVar3;
    }
    uVar19 = (ulong)(uVar4 - 1);
    while( true ) {
      apcStack_2688[0] = (code *)0x132e04;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar19,__n,uVar5);
      apcStack_2688[0] = (code *)0x132e1c;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      __n = (undefined1 *)(ulong)uVar3;
      apcStack_2688[0] = (code *)0x132e37;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_2604 = uVar3;
      if (uVar3 == 0xffffffff) break;
      puVar12 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_00132e99;
      __n = (undefined1 *)(ulong)uStack_25fc;
      apcStack_2688[0] = (code *)0x132e61;
      puVar14 = (undefined1 *)write(uVar3,pvVar9,(size_t)__n);
      if (puVar14 != __n) goto LAB_00132e9e;
      pcVar26 = (char *)(ulong)*(uint *)(pcVar26 + 4);
      apcStack_2688[0] = (code *)0x132e77;
      pcVar18 = (char *)write(uVar4,pvVar11,(size_t)pcVar26);
      if (pcVar18 != pcVar26) goto LAB_00132ea3;
      uVar19 = (ulong)uVar4;
      apcStack_2688[0] = (code *)0x132e88;
      test_bson_json_uescape_key_cold_4();
      uVar5 = extraout_RAX_02;
LAB_00132e88:
      uVar19 = uVar19 & 0xffffffff;
    }
  }
  apcStack_2688[0] = (code *)0x132e99;
  test_bson_json_uescape_key_cold_6();
LAB_00132e99:
  apcStack_2688[0] = (code *)0x132e9e;
  test_bson_json_uescape_key_cold_5();
LAB_00132e9e:
  apcStack_2688[0] = (code *)0x132ea3;
  test_bson_json_uescape_key_cold_2();
LAB_00132ea3:
  apcStack_2688[0] = test_bson_json_uescape_bad;
  test_bson_json_uescape_key_cold_3();
  pcStack_2a08 = (code *)0x132ed6;
  pcStack_2690 = pcVar26;
  apcStack_2688[0] = (code *)&pcStack_2288;
  cVar1 = bson_init_from_json(auStack_2a00,"{ \"bad\": \"\\u1\"}",0xffffffffffffffff,&iStack_2918);
  if (cVar1 == '\0') {
    if (iStack_2918 != 1) goto LAB_00132f22;
    if (iStack_2914 != 1) goto LAB_00132f27;
    pcVar26 = acStack_2910;
    pcStack_2a08 = (code *)0x132f09;
    pcVar18 = strstr(pcVar26,"UESCAPE_TOOSHORT");
    if (pcVar18 != (char *)0x0) {
      pcStack_2a08 = (code *)0x132f16;
      bson_destroy(auStack_2a00);
      return;
    }
  }
  else {
    pcStack_2a08 = (code *)0x132f22;
    test_bson_json_uescape_bad_cold_4();
LAB_00132f22:
    pcStack_2a08 = (code *)0x132f27;
    test_bson_json_uescape_bad_cold_1();
LAB_00132f27:
    pcStack_2a08 = (code *)0x132f2c;
    test_bson_json_uescape_bad_cold_2();
  }
  pcStack_2a08 = test_bson_json_int32;
  test_bson_json_uescape_bad_cold_3();
  pcStack_2e08 = (code *)0x132f67;
  pcStack_2a10 = pcVar26;
  pcStack_2a08 = (code *)apcStack_2688;
  cVar1 = bson_init_from_json(acStack_2d80,"{ \"x\": 2147483647 }",0xffffffffffffffff,auStack_2c98);
  if (cVar1 == '\0') {
LAB_00133159:
    pcStack_2e08 = (code *)0x133166;
    test_bson_json_int32_cold_1();
LAB_00133166:
    pcStack_2e08 = (code *)0x13316e;
    test_bson_json_int32_cold_4();
LAB_0013316e:
    pcStack_2e08 = (code *)0x13317b;
    test_bson_json_int32_cold_5();
  }
  else {
    pcStack_2e08 = (code *)0x132f86;
    cVar1 = bson_iter_init_find(auStack_2e00,acStack_2d80,"x");
    if (cVar1 == '\0') {
      pcStack_2e08 = (code *)0x133136;
      test_bson_json_int32_cold_2();
LAB_00133136:
      pcStack_2e08 = (code *)0x13313b;
      test_bson_json_int32_cold_3();
LAB_0013313b:
      pcStack_2e08 = (code *)0x133140;
      test_bson_json_int32_cold_6();
LAB_00133140:
      pcStack_2e08 = (code *)0x133145;
      test_bson_json_int32_cold_7();
      pcStack_2e08 = (code *)0x13314a;
      test_bson_json_int32_cold_10();
      pcStack_2e08 = (code *)0x13314f;
      test_bson_json_int32_cold_11();
      pcStack_2e08 = (code *)0x133154;
      test_bson_json_int32_cold_14();
      pcStack_2e08 = (code *)0x133159;
      test_bson_json_int32_cold_15();
      goto LAB_00133159;
    }
    pcStack_2e08 = (code *)0x132f96;
    iVar2 = bson_iter_type(auStack_2e00);
    if (iVar2 != 0x10) goto LAB_00133136;
    pcStack_2e08 = (code *)0x132fa7;
    iVar2 = bson_iter_int32(auStack_2e00);
    if (iVar2 != 0x7fffffff) goto LAB_00133166;
    pcVar26 = acStack_2d80;
    pcStack_2e08 = (code *)0x132fc2;
    bson_destroy(pcVar26);
    pcStack_2e08 = (code *)0x132fe0;
    cVar1 = bson_init_from_json(pcVar26,"{ \"x\": -2147483648 }",0xffffffffffffffff,auStack_2c98);
    if (cVar1 == '\0') goto LAB_0013316e;
    pcStack_2e08 = (code *)0x132fff;
    cVar1 = bson_iter_init_find(auStack_2e00,acStack_2d80,"x");
    if (cVar1 == '\0') goto LAB_0013313b;
    pcStack_2e08 = (code *)0x13300f;
    iVar2 = bson_iter_type(auStack_2e00);
    if (iVar2 != 0x10) goto LAB_00133140;
    pcStack_2e08 = (code *)0x133020;
    bson_iter_int32(auStack_2e00);
  }
  pcStack_2e08 = (code *)0x133183;
  test_bson_json_int32_cold_8();
  pcStack_2e08 = (code *)0x133190;
  test_bson_json_int32_cold_9();
  pcStack_2e08 = (code *)0x133198;
  test_bson_json_int32_cold_12();
  pcStack_2e08 = (code *)0x1331a5;
  test_bson_json_int32_cold_13();
  pcStack_2e08 = test_bson_json_int64;
  test_bson_json_int32_cold_16();
  pcStack_3208 = (code *)0x1331e2;
  pcStack_2e18 = pcVar26;
  pvStack_2e10 = pvVar11;
  pcStack_2e08 = (code *)&pcStack_2a08;
  cVar1 = bson_init_from_json(acStack_3180,"{ \"x\": 9223372036854775807 }",0xffffffffffffffff,
                              &iStack_30a0);
  if (cVar1 == '\0') {
LAB_0013347b:
    pcStack_3208 = (code *)0x133488;
    test_bson_json_int64_cold_1();
LAB_00133488:
    pcStack_3208 = (code *)0x133490;
    test_bson_json_int64_cold_4();
LAB_00133490:
    pcStack_3208 = (code *)0x13349d;
    test_bson_json_int64_cold_5();
LAB_0013349d:
    pcStack_3208 = (code *)0x1334a5;
    test_bson_json_int64_cold_8();
LAB_001334a5:
    pcStack_3208 = (code *)0x1334aa;
    test_bson_json_int64_cold_9();
LAB_001334aa:
    pcStack_3208 = (code *)0x1334af;
    test_bson_json_int64_cold_10();
LAB_001334af:
    pcStack_3208 = (code *)0x1334b7;
    test_bson_json_int64_cold_23();
LAB_001334b7:
    pcStack_3208 = (code *)0x1334bc;
    test_bson_json_int64_cold_11();
LAB_001334bc:
    pcStack_3208 = (code *)0x1334c1;
    test_bson_json_int64_cold_12();
LAB_001334c1:
    pcStack_3208 = (code *)0x1334c9;
    test_bson_json_int64_cold_21();
LAB_001334c9:
    pcStack_3208 = (code *)0x1334ce;
    test_bson_json_int64_cold_13();
LAB_001334ce:
    pcStack_3208 = (code *)0x1334d3;
    test_bson_json_int64_cold_14();
LAB_001334d3:
    pcStack_3208 = (code *)0x1334db;
    test_bson_json_int64_cold_19();
LAB_001334db:
    pcStack_3208 = (code *)0x1334e0;
    test_bson_json_int64_cold_15();
LAB_001334e0:
    pcStack_3208 = (code *)0x1334e5;
    test_bson_json_int64_cold_16();
  }
  else {
    pcStack_3208 = (code *)0x133201;
    cVar1 = bson_iter_init_find(auStack_3200,acStack_3180,"x");
    if (cVar1 == '\0') {
      pcStack_3208 = (code *)0x133458;
      test_bson_json_int64_cold_2();
LAB_00133458:
      pcStack_3208 = (code *)0x13345d;
      test_bson_json_int64_cold_3();
LAB_0013345d:
      pcStack_3208 = (code *)0x133462;
      test_bson_json_int64_cold_6();
LAB_00133462:
      pcStack_3208 = (code *)0x133467;
      test_bson_json_int64_cold_7();
LAB_00133467:
      pcStack_3208 = (code *)0x13346c;
      test_bson_json_int64_cold_24();
LAB_0013346c:
      pcStack_3208 = (code *)0x133471;
      test_bson_json_int64_cold_22();
LAB_00133471:
      pcStack_3208 = (code *)0x133476;
      test_bson_json_int64_cold_20();
LAB_00133476:
      pcStack_3208 = (code *)0x13347b;
      test_bson_json_int64_cold_18();
      goto LAB_0013347b;
    }
    pcStack_3208 = (code *)0x133211;
    iVar2 = bson_iter_type(auStack_3200);
    if (iVar2 != 0x12) goto LAB_00133458;
    pvVar11 = (void *)0x7fffffffffffffff;
    pcStack_3208 = (code *)0x13322c;
    lVar6 = bson_iter_int64(auStack_3200);
    if (lVar6 != 0x7fffffffffffffff) goto LAB_00133488;
    pcVar26 = acStack_3180;
    pcStack_3208 = (code *)0x133245;
    bson_destroy(pcVar26);
    pcStack_3208 = (code *)0x133263;
    cVar1 = bson_init_from_json(pcVar26,"{ \"x\": -9223372036854775808 }",0xffffffffffffffff,
                                &iStack_30a0);
    if (cVar1 == '\0') goto LAB_00133490;
    pcStack_3208 = (code *)0x133282;
    cVar1 = bson_iter_init_find(auStack_3200,acStack_3180,"x");
    if (cVar1 == '\0') goto LAB_0013345d;
    pcStack_3208 = (code *)0x133292;
    iVar2 = bson_iter_type(auStack_3200);
    if (iVar2 != 0x12) goto LAB_00133462;
    pcStack_3208 = (code *)0x1332a3;
    lVar6 = bson_iter_int64(auStack_3200);
    pvVar11 = (void *)0x8000000000000000;
    if (lVar6 != -0x8000000000000000) goto LAB_0013349d;
    pcVar26 = acStack_3180;
    pcStack_3208 = (code *)0x1332bf;
    bson_destroy(pcVar26);
    pcStack_3208 = (code *)0x1332dd;
    cVar1 = bson_init_from_json(pcVar26,"{ \"x\": 9223372036854775808 }",0xffffffffffffffff,
                                &iStack_30a0);
    if (cVar1 != '\0') goto LAB_00133467;
    if (iStack_30a0 != 1) goto LAB_001334a5;
    if (iStack_309c != 2) goto LAB_001334aa;
    pcVar26 = acStack_3098;
    pcStack_3208 = (code *)0x13331c;
    pcVar18 = strstr(pcVar26,"Number \"9223372036854775808\" is out of range");
    if (pcVar18 == (char *)0x0) goto LAB_001334af;
    pcStack_3208 = (code *)0x133348;
    cVar1 = bson_init_from_json(acStack_3180,"{ \"x\": -9223372036854775809 }",0xffffffffffffffff,
                                &iStack_30a0);
    if (cVar1 != '\0') goto LAB_0013346c;
    if (iStack_30a0 != 1) goto LAB_001334b7;
    if (iStack_309c != 2) goto LAB_001334bc;
    pcStack_3208 = (code *)0x13337f;
    pcVar18 = strstr(pcVar26,"Number \"-9223372036854775809\" is out of range");
    if (pcVar18 == (char *)0x0) goto LAB_001334c1;
    pcStack_3208 = (code *)0x1333ab;
    cVar1 = bson_init_from_json(acStack_3180,"{ \"x\": 10000000000000000000 }",0xffffffffffffffff,
                                &iStack_30a0);
    if (cVar1 != '\0') goto LAB_00133471;
    if (iStack_30a0 != 1) goto LAB_001334c9;
    if (iStack_309c != 2) goto LAB_001334ce;
    pcStack_3208 = (code *)0x1333e2;
    pcVar18 = strstr(pcVar26,"Number \"10000000000000000000\" is out of range");
    if (pcVar18 == (char *)0x0) goto LAB_001334d3;
    pcStack_3208 = (code *)0x13340e;
    cVar1 = bson_init_from_json(acStack_3180,"{ \"x\": -10000000000000000000 }",0xffffffffffffffff,
                                &iStack_30a0);
    if (cVar1 != '\0') goto LAB_00133476;
    if (iStack_30a0 != 1) goto LAB_001334db;
    if (iStack_309c != 2) goto LAB_001334e0;
    pcStack_3208 = (code *)0x133441;
    pcVar18 = strstr(pcVar26,"Number \"-10000000000000000000\" is out of range");
    if (pcVar18 != (char *)0x0) {
      return;
    }
  }
  pcStack_3208 = test_bson_json_double;
  test_bson_json_int64_cold_17();
  pcStack_3608 = (code *)0x133520;
  pcStack_3210 = pcVar26;
  pcStack_3208 = (code *)&pcStack_2e08;
  cVar1 = bson_init_from_json(acStack_3580,"{ \"x\": 1 }",0xffffffffffffffff,auStack_3498);
  if (cVar1 == '\0') {
LAB_001337c5:
    pcStack_3608 = (code *)0x1337d2;
    test_bson_json_double_cold_1();
LAB_001337d2:
    pcStack_3608 = (code *)0x1337da;
    test_bson_json_double_cold_4();
LAB_001337da:
    pcStack_3608 = (code *)0x1337e7;
    test_bson_json_double_cold_5();
LAB_001337e7:
    pcStack_3608 = (code *)0x1337ef;
    test_bson_json_double_cold_8();
LAB_001337ef:
    pcStack_3608 = (code *)0x1337fc;
    test_bson_json_double_cold_9();
LAB_001337fc:
    pcStack_3608 = (code *)0x133804;
    test_bson_json_double_cold_12();
LAB_00133804:
    pcStack_3608 = (code *)0x133811;
    test_bson_json_double_cold_13();
LAB_00133811:
    pcStack_3608 = (code *)0x133819;
    test_bson_json_double_cold_16();
LAB_00133819:
    pcStack_3608 = (code *)0x133826;
    test_bson_json_double_cold_17();
  }
  else {
    pcStack_3608 = (code *)0x13353f;
    cVar1 = bson_iter_init_find(auStack_3600,acStack_3580,"x");
    if (cVar1 == '\0') {
      pcStack_3608 = (code *)0x133793;
      test_bson_json_double_cold_2();
LAB_00133793:
      pcStack_3608 = (code *)0x133798;
      test_bson_json_double_cold_3();
LAB_00133798:
      pcStack_3608 = (code *)0x13379d;
      test_bson_json_double_cold_6();
LAB_0013379d:
      pcStack_3608 = (code *)0x1337a2;
      test_bson_json_double_cold_7();
LAB_001337a2:
      pcStack_3608 = (code *)0x1337a7;
      test_bson_json_double_cold_10();
LAB_001337a7:
      pcStack_3608 = (code *)0x1337ac;
      test_bson_json_double_cold_11();
LAB_001337ac:
      pcStack_3608 = (code *)0x1337b1;
      test_bson_json_double_cold_14();
LAB_001337b1:
      pcStack_3608 = (code *)0x1337b6;
      test_bson_json_double_cold_15();
LAB_001337b6:
      pcStack_3608 = (code *)0x1337bb;
      test_bson_json_double_cold_18();
LAB_001337bb:
      pcStack_3608 = (code *)0x1337c0;
      test_bson_json_double_cold_19();
LAB_001337c0:
      pcStack_3608 = (code *)0x1337c5;
      test_bson_json_double_cold_21();
      goto LAB_001337c5;
    }
    pcStack_3608 = (code *)0x13354f;
    iVar2 = bson_iter_type(auStack_3600);
    if (iVar2 != 0x10) goto LAB_00133793;
    pcStack_3608 = (code *)0x133560;
    iVar2 = bson_iter_int32(auStack_3600);
    if (iVar2 != 1) goto LAB_001337d2;
    pcVar26 = acStack_3580;
    pcStack_3608 = (code *)0x133579;
    bson_destroy(pcVar26);
    pcStack_3608 = (code *)0x133597;
    cVar1 = bson_init_from_json(pcVar26,"{ \"x\": 4294967296 }",0xffffffffffffffff,auStack_3498);
    if (cVar1 == '\0') goto LAB_001337da;
    pcStack_3608 = (code *)0x1335b6;
    cVar1 = bson_iter_init_find(auStack_3600,acStack_3580,"x");
    if (cVar1 == '\0') goto LAB_00133798;
    pcStack_3608 = (code *)0x1335c6;
    iVar2 = bson_iter_type(auStack_3600);
    if (iVar2 != 0x12) goto LAB_0013379d;
    pcStack_3608 = (code *)0x1335d7;
    lVar6 = bson_iter_int64(auStack_3600);
    if (lVar6 != 0x100000000) goto LAB_001337e7;
    pcVar26 = acStack_3580;
    pcStack_3608 = (code *)0x1335fa;
    bson_destroy(pcVar26);
    pcStack_3608 = (code *)0x133618;
    cVar1 = bson_init_from_json(pcVar26,"{ \"x\": 1.0 }",0xffffffffffffffff,auStack_3498);
    if (cVar1 == '\0') goto LAB_001337ef;
    pcStack_3608 = (code *)0x133637;
    cVar1 = bson_iter_init_find(auStack_3600,acStack_3580,"x");
    if (cVar1 == '\0') goto LAB_001337a2;
    pcStack_3608 = (code *)0x133647;
    iVar2 = bson_iter_type(auStack_3600);
    if (iVar2 != 1) goto LAB_001337a7;
    pcStack_3608 = (code *)0x133658;
    dVar29 = (double)bson_iter_double(auStack_3600);
    if ((dVar29 != 1.0) || (NAN(dVar29))) goto LAB_001337fc;
    pcVar26 = acStack_3580;
    pcStack_3608 = (code *)0x13367c;
    bson_destroy(pcVar26);
    pcStack_3608 = (code *)0x13369a;
    cVar1 = bson_init_from_json(pcVar26,"{ \"x\": 0.0 }",0xffffffffffffffff,auStack_3498);
    if (cVar1 == '\0') goto LAB_00133804;
    pcStack_3608 = (code *)0x1336b9;
    cVar1 = bson_iter_init_find(auStack_3600,acStack_3580,"x");
    if (cVar1 == '\0') goto LAB_001337ac;
    pcStack_3608 = (code *)0x1336c9;
    iVar2 = bson_iter_type(auStack_3600);
    if (iVar2 != 1) goto LAB_001337b1;
    pcStack_3608 = (code *)0x1336da;
    dVar29 = (double)bson_iter_double(auStack_3600);
    if ((dVar29 != 0.0) || (NAN(dVar29))) goto LAB_00133811;
    pcVar26 = acStack_3580;
    pcStack_3608 = (code *)0x1336fe;
    bson_destroy(pcVar26);
    pcStack_3608 = (code *)0x13371c;
    cVar1 = bson_init_from_json(pcVar26,"{ \"x\": -0.0 }",0xffffffffffffffff,auStack_3498);
    if (cVar1 == '\0') goto LAB_00133819;
    pcStack_3608 = (code *)0x13373b;
    cVar1 = bson_iter_init_find(auStack_3600,acStack_3580,"x");
    if (cVar1 == '\0') goto LAB_001337b6;
    pcStack_3608 = (code *)0x133747;
    iVar2 = bson_iter_type(auStack_3600);
    if (iVar2 != 1) goto LAB_001337bb;
    pcStack_3608 = (code *)0x133754;
    dVar29 = (double)bson_iter_double(auStack_3600);
    if ((dVar29 == 0.0) && (!NAN(dVar29))) {
      pcStack_3608 = (code *)0x133770;
      bson_iter_double(auStack_3600);
      if (extraout_XMM0_Db < 0) {
        pcStack_3608 = (code *)0x133787;
        bson_destroy(acStack_3580);
        return;
      }
      goto LAB_001337c0;
    }
  }
  pcStack_3608 = test_bson_json_double_overflow;
  test_bson_json_double_cold_20();
  pcVar18 = "2e400";
  ppuVar21 = &PTR_anon_var_dwarf_1aedf_00163308;
  pcStack_3630 = pcVar26;
  puStack_3628 = __n;
  puStack_3620 = puVar12;
  pvStack_3618 = pvVar11;
  pvStack_3610 = pvVar9;
  pcStack_3608 = (code *)&pcStack_3208;
  while( true ) {
    pcStack_3988 = (code *)0x13386c;
    uVar5 = bson_strdup_printf("{ \"d\" : %s }",pcVar18);
    pcStack_3988 = (code *)0x133889;
    cVar1 = bson_init_from_json(auStack_3780,uVar5,0xffffffffffffffff,&iStack_3980);
    if (cVar1 != '\0') break;
    if (iStack_3980 != 1) goto LAB_00133953;
    if (iStack_397c != 2) goto LAB_0013394e;
    pcStack_3988 = (code *)0x1338b7;
    pcVar26 = strstr(acStack_3978,"out of range");
    if (pcVar26 == (char *)0x0) goto LAB_00133958;
    pcStack_3988 = (code *)0x1338c8;
    bson_free(uVar5);
    pcStack_3988 = (code *)0x1338d9;
    uVar5 = bson_strdup_printf("{ \"d\" : { \"$numberDouble\" : \"%s\" } }",pcVar18);
    pcStack_3988 = (code *)0x1338f6;
    cVar1 = bson_init_from_json(auStack_3780,uVar5,0xffffffffffffffff,&iStack_3980);
    if (cVar1 != '\0') goto LAB_00133949;
    if (iStack_3980 != 1) goto LAB_00133967;
    if (iStack_397c != 2) goto LAB_00133962;
    pcStack_3988 = (code *)0x133918;
    pcVar26 = strstr(acStack_3978,"out of range");
    if (pcVar26 == (char *)0x0) goto LAB_0013396c;
    pcStack_3988 = (code *)0x133925;
    bson_free(uVar5);
    pcVar18 = *ppuVar21;
    ppuVar21 = ppuVar21 + 1;
    if (pcVar18 == (char *)0x0) {
      return;
    }
  }
  pcStack_3988 = (code *)0x133949;
  test_bson_json_double_overflow_cold_8();
LAB_00133949:
  pcStack_3988 = (code *)0x13394e;
  test_bson_json_double_overflow_cold_6();
LAB_0013394e:
  pcStack_3988 = (code *)0x133953;
  test_bson_json_double_overflow_cold_2();
LAB_00133953:
  pcStack_3988 = (code *)0x133958;
  test_bson_json_double_overflow_cold_1();
LAB_00133958:
  pcStack_3988 = (code *)0x133962;
  test_bson_json_double_overflow_cold_7();
LAB_00133962:
  pcStack_3988 = (code *)0x133967;
  test_bson_json_double_overflow_cold_4();
LAB_00133967:
  pcStack_3988 = (code *)0x13396c;
  test_bson_json_double_overflow_cold_3();
LAB_0013396c:
  pcStack_3988 = test_bson_json_nan;
  test_bson_json_double_overflow_cold_5();
  pcStack_39a0 = "out of range";
  pcVar7 = "{ \"d\": NaN }";
  ppuVar25 = &PTR_anon_var_dwarf_1af33_00163328;
  __haystack = aiStack_3d00;
  piVar27 = &iStack_3c38;
  piVar28 = (int *)0x14c766;
  pcVar26 = (char *)&dStack_3d08;
  uStack_39b0 = uVar5;
  puStack_39a8 = (undefined1 *)&iStack_3980;
  pcStack_3998 = pcVar18;
  ppuStack_3990 = ppuVar21;
  pcStack_3988 = (code *)&pcStack_3608;
  do {
    apcStack_3d88[0] = (code *)0x1339ca;
    cVar1 = bson_init_from_json(__haystack,pcVar7,0xffffffffffffffff,piVar27);
    if (cVar1 == '\0') {
      apcStack_3d88[0] = (code *)0x133b2b;
      test_bson_json_nan_cold_1();
LAB_00133b2b:
      apcStack_3d88[0] = (code *)0x133b30;
      test_bson_json_nan_cold_2();
LAB_00133b30:
      apcStack_3d88[0] = (code *)0x133b35;
      test_bson_json_nan_cold_3();
      goto LAB_00133b35;
    }
    apcStack_3d88[0] = (code *)0x1339d7;
    uVar5 = bson_bcone_magic();
    apcStack_3d88[0] = (code *)0x1339f2;
    cVar1 = bcon_extract(__haystack,"d",uVar5,1,pcVar26,0);
    if (cVar1 == '\0') goto LAB_00133b2b;
    if (!NAN(dStack_3d08) && !NAN(dStack_3d08)) goto LAB_00133b30;
    apcStack_3d88[0] = (code *)0x133a12;
    bson_destroy(__haystack);
    pcVar7 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
  } while (pcVar7 != (char *)0x0);
  pcVar18 = "{ \"d\": NaNn }";
  ppuVar25 = &PTR_anon_var_dwarf_1af63_00163358;
  __haystack = aiStack_3c30;
  piVar27 = aiStack_3d00;
  piVar28 = &iStack_3c38;
  pcVar26 = "Got parse error at";
  do {
    apcStack_3d88[0] = (code *)0x133a5e;
    cVar1 = bson_init_from_json(piVar27,pcVar18,0xffffffffffffffff,piVar28);
    if (cVar1 != '\0') goto LAB_00133b35;
    if (iStack_3c38 != 1) goto LAB_00133b4c;
    if (iStack_3c34 != 1) goto LAB_00133b3f;
    apcStack_3d88[0] = (code *)0x133a91;
    pcVar18 = strstr((char *)__haystack,"Got parse error at");
    if (pcVar18 == (char *)0x0) goto LAB_00133b44;
    pcVar18 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
  } while (pcVar18 != (char *)0x0);
  pcVar18 = "{ \"d\": nu";
  ppuVar25 = &PTR_anon_var_dwarf_1afab_00163398;
  piVar27 = aiStack_3d00;
  piVar28 = &iStack_3c38;
  pcVar26 = "Incomplete JSON";
  while( true ) {
    apcStack_3d88[0] = (code *)0x133ade;
    cVar1 = bson_init_from_json(piVar27,pcVar18,0xffffffffffffffff,piVar28);
    if (cVar1 != '\0') break;
    if (iStack_3c38 != 1) goto LAB_00133b5e;
    if (iStack_3c34 != 1) goto LAB_00133b51;
    apcStack_3d88[0] = (code *)0x133b05;
    pcVar18 = strstr((char *)__haystack,"Incomplete JSON");
    if (pcVar18 == (char *)0x0) goto LAB_00133b56;
    pcVar18 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
    if (pcVar18 == (char *)0x0) {
      return;
    }
  }
LAB_00133b3a:
  apcStack_3d88[0] = (code *)0x133b3f;
  test_bson_json_nan_cold_9();
LAB_00133b3f:
  apcStack_3d88[0] = (code *)0x133b44;
  test_bson_json_nan_cold_5();
LAB_00133b44:
  apcStack_3d88[0] = (code *)0x133b4c;
  test_bson_json_nan_cold_10();
LAB_00133b4c:
  apcStack_3d88[0] = (code *)0x133b51;
  test_bson_json_nan_cold_4();
LAB_00133b51:
  apcStack_3d88[0] = (code *)0x133b56;
  test_bson_json_nan_cold_7();
LAB_00133b56:
  apcStack_3d88[0] = (code *)0x133b5e;
  test_bson_json_nan_cold_8();
LAB_00133b5e:
  apcStack_3d88[0] = test_bson_json_infinity;
  test_bson_json_nan_cold_6();
  pcVar18 = "{ \"d\": Infinity }";
  ppuVar21 = &PTR_anon_var_dwarf_1b023_001633b8;
  piStack_3db0 = __haystack;
  pdStack_3da8 = (double *)pcVar26;
  ppuStack_3da0 = ppuVar25;
  piStack_3d98 = piVar27;
  piStack_3d90 = piVar28;
  apcStack_3d88[0] = (code *)&pcStack_3988;
  do {
    apcStack_4188[0] = (code *)0x133bb4;
    cVar1 = bson_init_from_json(auStack_4100,pcVar18,0xffffffffffffffff,&iStack_4038);
    if (cVar1 == '\0') {
      apcStack_4188[0] = (code *)0x133dd5;
      test_bson_json_infinity_cold_1();
LAB_00133dd5:
      apcStack_4188[0] = (code *)0x133dda;
      test_bson_json_infinity_cold_2();
LAB_00133dda:
      apcStack_4188[0] = (code *)0x133ddf;
      test_bson_json_infinity_cold_3();
      goto LAB_00133ddf;
    }
    apcStack_4188[0] = (code *)0x133bc1;
    __haystack = (int *)bson_bcone_magic();
    apcStack_4188[0] = (code *)0x133bdf;
    cVar1 = bcon_extract(auStack_4100,"d",__haystack,1,&puStack_4108,0);
    if (cVar1 == '\0') goto LAB_00133dd5;
    if ((NAN((double)puStack_4108)) ||
       (!NAN((double)puStack_4108 - (double)puStack_4108) &&
        !NAN((double)puStack_4108 - (double)puStack_4108))) goto LAB_00133dda;
    apcStack_4188[0] = (code *)0x133c0d;
    bson_destroy(auStack_4100);
    pcVar18 = *ppuVar21;
    ppuVar21 = ppuVar21 + 1;
  } while (pcVar18 != (char *)0x0);
  pcVar26 = "{ \"d\": -Infinity }";
  ppuVar21 = &PTR_anon_var_dwarf_1b047_001633d8;
  do {
    apcStack_4188[0] = (code *)0x133c52;
    cVar1 = bson_init_from_json(auStack_4100,pcVar26,0xffffffffffffffff,&iStack_4038);
    if (cVar1 == '\0') goto LAB_00133ddf;
    apcStack_4188[0] = (code *)0x133c75;
    cVar1 = bcon_extract(auStack_4100,"d",__haystack,1,&puStack_4108,0);
    if (cVar1 == '\0') goto LAB_00133de4;
    if ((NAN((double)puStack_4108)) || (!NAN((double)puStack_4108 - (double)puStack_4108)))
    goto LAB_00133de9;
    if (0.0 <= (double)puStack_4108) goto LAB_00133dee;
    apcStack_4188[0] = (code *)0x133cb5;
    bson_destroy(auStack_4100);
    pcVar26 = *ppuVar21;
    ppuVar21 = ppuVar21 + 1;
  } while (pcVar26 != (char *)0x0);
  pcVar18 = "{ \"d\": Infinityy }";
  ppuVar25 = &PTR_anon_var_dwarf_1b06b_001633f8;
  __haystack = aiStack_4030;
  ppuVar21 = (undefined **)&iStack_4038;
  pcVar26 = "Got parse error at";
  do {
    apcStack_4188[0] = (code *)0x133d04;
    cVar1 = bson_init_from_json(auStack_4100,pcVar18,0xffffffffffffffff,ppuVar21);
    if (cVar1 != '\0') goto LAB_00133df3;
    if (iStack_4038 != 1) goto LAB_00133e0a;
    if (iStack_4034 != 1) goto LAB_00133dfd;
    apcStack_4188[0] = (code *)0x133d37;
    pcVar18 = strstr((char *)__haystack,"Got parse error at");
    if (pcVar18 == (char *)0x0) goto LAB_00133e02;
    pcVar18 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
  } while (pcVar18 != (char *)0x0);
  pcVar18 = "{ \"d\": In";
  ppuVar25 = &PTR_anon_var_dwarf_1b0cb_00163448;
  ppuVar21 = (undefined **)&iStack_4038;
  pcVar26 = "Incomplete JSON";
  while( true ) {
    apcStack_4188[0] = (code *)0x133d84;
    cVar1 = bson_init_from_json(auStack_4100,pcVar18,0xffffffffffffffff,ppuVar21);
    if (cVar1 != '\0') break;
    if (iStack_4038 != 1) goto LAB_00133e1c;
    if (iStack_4034 != 1) goto LAB_00133e0f;
    apcStack_4188[0] = (code *)0x133daf;
    pcVar18 = strstr((char *)__haystack,"Incomplete JSON");
    if (pcVar18 == (char *)0x0) goto LAB_00133e14;
    pcVar18 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
    if (pcVar18 == (char *)0x0) {
      return;
    }
  }
LAB_00133df8:
  apcStack_4188[0] = (code *)0x133dfd;
  test_bson_json_infinity_cold_13();
LAB_00133dfd:
  apcStack_4188[0] = (code *)0x133e02;
  test_bson_json_infinity_cold_9();
LAB_00133e02:
  apcStack_4188[0] = (code *)0x133e0a;
  test_bson_json_infinity_cold_14();
LAB_00133e0a:
  apcStack_4188[0] = (code *)0x133e0f;
  test_bson_json_infinity_cold_8();
LAB_00133e0f:
  apcStack_4188[0] = (code *)0x133e14;
  test_bson_json_infinity_cold_11();
LAB_00133e14:
  apcStack_4188[0] = (code *)0x133e1c;
  test_bson_json_infinity_cold_12();
LAB_00133e1c:
  puVar12 = auStack_4100;
  apcStack_4188[0] = test_bson_json_null;
  test_bson_json_infinity_cold_10();
  pcStack_4508 = (code *)0x133e4e;
  apcStack_4188[0] = (code *)apcStack_3d88;
  cVar1 = bson_init_from_json(auStack_4500,"{ \"x\": null }",0xffffffffffffffff,auStack_4410);
  if (cVar1 == '\0') {
    pcStack_4508 = (code *)0x133e89;
    test_bson_json_null_cold_1();
  }
  else {
    pcStack_4508 = (code *)0x133e57;
    uVar5 = bson_bcone_magic();
    pcStack_4508 = (code *)0x133e73;
    cVar1 = bcon_extract(auStack_4500,"x",uVar5,9,0);
    if (cVar1 != '\0') {
      pcStack_4508 = (code *)0x133e7f;
      bson_destroy(auStack_4500);
      return;
    }
  }
  pcStack_4508 = test_bson_json_empty_final_object;
  test_bson_json_null_cold_2();
  pcStack_4908 = (code *)0x0;
  pcStack_4910 = "}";
  acStack_4920[8] = -0x2e;
  acStack_4920[9] = '>';
  acStack_4920[10] = '\x13';
  acStack_4920[0xb] = '\0';
  acStack_4920[0xc] = '\0';
  acStack_4920[0xd] = '\0';
  acStack_4920[0xe] = '\0';
  acStack_4920[0xf] = '\0';
  piStack_4530 = __haystack;
  pcStack_4528 = pcVar26;
  ppuStack_4520 = ppuVar25;
  puStack_4518 = puVar12;
  ppuStack_4510 = ppuVar21;
  pcStack_4508 = (code *)apcStack_4188;
  uVar19 = bcon_new(0,"a","{","b","{");
  uStack_4810 = 0;
  uStack_4808 = 0;
  uStack_4820 = 0;
  uStack_4818 = 0;
  uStack_4830 = 0;
  uStack_4828 = 0;
  uStack_4840 = 0;
  uStack_4838 = 0;
  uStack_4850 = 0;
  uStack_4848 = 0;
  uStack_4860 = 0;
  uStack_4858 = 0;
  uStack_4870 = 0;
  uStack_4868 = 0;
  uStack_4880 = (undefined *)0x500000003;
  uStack_4878 = 5;
  pcStack_4908 = (code *)0x133f2f;
  cVar1 = bson_init_from_json(&uStack_4880,"{\"a\": {\"b\": {}}}",0xffffffffffffffff,auStack_47b8);
  if (cVar1 != '\0') {
    pcStack_4908 = (code *)0x133f47;
    ppuVar21 = (undefined **)bson_get_data(&uStack_4880);
    pcStack_4908 = (code *)0x133f52;
    puVar12 = (undefined1 *)bson_get_data(uVar19);
    if (*(int *)(uVar19 + 4) == uStack_4880._4_4_) {
      pcStack_4908 = (code *)0x133f67;
      pvVar9 = (void *)bson_get_data(uVar19);
      pcStack_4908 = (code *)0x133f77;
      pvVar10 = (void *)bson_get_data(&uStack_4880);
      pcStack_4908 = (code *)0x133f85;
      iVar2 = bcmp(pvVar9,pvVar10,(ulong)*(uint *)(uVar19 + 4));
      if (iVar2 == 0) {
        pcStack_4908 = (code *)0x133f96;
        bson_destroy(&uStack_4880);
        pcStack_4908 = (code *)0x133f9e;
        bson_destroy(uVar19);
        return;
      }
    }
    ppuVar25 = (undefined **)&uStack_4880;
    pcStack_4908 = (code *)0x133fbf;
    pcVar26 = (char *)bson_as_canonical_extended_json(ppuVar25);
    pcStack_4908 = (code *)0x133fcc;
    uVar5 = bson_as_canonical_extended_json(uVar19);
    uVar3 = *(uint *)(uVar19 + 4);
    if (uStack_4880._4_4_ != 0) {
      uVar20 = 0;
      do {
        if (uVar3 == (uint)uVar20) break;
        if (*(char *)((long)ppuVar21 + uVar20) != puVar12[uVar20]) goto LAB_0013409c;
        uVar20 = uVar20 + 1;
      } while (uStack_4880._4_4_ != (uint)uVar20);
    }
    uVar4 = uStack_4880._4_4_;
    if (uStack_4880._4_4_ < uVar3) {
      uVar4 = uVar3;
    }
    uVar20 = (ulong)(uVar4 - 1);
    while( true ) {
      pcStack_4908 = (code *)0x134018;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,pcVar26,uVar5);
      pcStack_4908 = (code *)0x134030;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      pcVar26 = (char *)(ulong)uVar3;
      pcStack_4908 = (code *)0x13404b;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_4884 = uVar3;
      if (uVar3 == 0xffffffff) break;
      ppuVar25 = (undefined **)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_001340a8;
      pcVar26 = (char *)((ulong)uStack_4880 >> 0x20);
      pcStack_4908 = (code *)0x134075;
      pcVar18 = (char *)write(uVar3,ppuVar21,(size_t)pcVar26);
      if (pcVar18 != pcVar26) goto LAB_001340ad;
      uVar19 = (ulong)*(uint *)(uVar19 + 4);
      pcStack_4908 = (code *)0x13408b;
      uVar20 = write(uVar4,puVar12,uVar19);
      if (uVar20 != uVar19) goto LAB_001340b2;
      uVar20 = (ulong)uVar4;
      pcStack_4908 = (code *)0x13409c;
      test_bson_json_empty_final_object_cold_4();
      uVar5 = extraout_RAX_03;
LAB_0013409c:
      uVar20 = uVar20 & 0xffffffff;
    }
    pcStack_4908 = (code *)0x1340a8;
    test_bson_json_empty_final_object_cold_6();
LAB_001340a8:
    pcStack_4908 = (code *)0x1340ad;
    test_bson_json_empty_final_object_cold_5();
LAB_001340ad:
    pcStack_4908 = (code *)0x1340b2;
    test_bson_json_empty_final_object_cold_2();
LAB_001340b2:
    pcStack_4908 = (code *)0x1340b7;
    test_bson_json_empty_final_object_cold_3();
  }
  pcStack_4908 = test_bson_as_json_decimal128;
  test_bson_json_empty_final_object_cold_1();
  pcVar18 = acStack_4920;
  acStack_4920[8] = '\0';
  acStack_4920[9] = '\0';
  acStack_4920[10] = '\0';
  acStack_4920[0xb] = '\0';
  acStack_4920[0xc] = '\0';
  acStack_4920[0xd] = '\0';
  acStack_4920[0xe] = '@';
  acStack_4920[0xf] = '0';
  acStack_4920[0] = '\v';
  acStack_4920[1] = '\0';
  acStack_4920[2] = '\0';
  acStack_4920[3] = '\0';
  acStack_4920[4] = '\0';
  acStack_4920[5] = '\0';
  acStack_4920[6] = '\0';
  acStack_4920[7] = '\0';
  pcStack_4930 = (code *)0x1340ea;
  pcStack_4910 = (char *)uVar19;
  pcStack_4908 = (code *)puVar12;
  plVar15 = (long *)bson_new();
  pcStack_4930 = (code *)0x134104;
  cVar1 = bson_append_decimal128(plVar15,"decimal128",0xffffffff,pcVar18);
  if (cVar1 == '\0') {
    pcStack_4930 = (code *)0x134152;
    test_bson_as_json_decimal128_cold_1();
  }
  else {
    pcStack_4930 = (code *)0x134113;
    pcVar18 = (char *)bson_as_json(plVar15,auStack_4928);
    if (pcVar18 == "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }") {
LAB_00134135:
      pcStack_4930 = (code *)0x13413d;
      bson_free(pcVar18);
      pcStack_4930 = (code *)0x134145;
      bson_destroy(plVar15);
      return;
    }
    pcStack_4930 = (code *)0x134131;
    iVar2 = strcmp(pcVar18,"{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
    if (iVar2 == 0) goto LAB_00134135;
  }
  pcStack_4930 = test_bson_json_number_decimal;
  test_bson_as_json_decimal128_cold_2();
  ppcVar30 = &pcStack_4930;
  ppuStack_4d88 = (undefined **)0x13418d;
  plStack_4938 = plVar15;
  pcStack_4930 = (code *)&pcStack_4508;
  cVar1 = bson_init_from_json(auStack_4c80,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,auStack_4b98);
  if (cVar1 == '\0') goto LAB_00134231;
  ppuStack_4d88 = (undefined **)0x1341aa;
  cVar1 = bson_iter_init(auStack_4d00,auStack_4c80);
  if (cVar1 == '\0') {
    ppuStack_4d88 = (undefined **)0x13421d;
    test_bson_json_number_decimal_cold_2();
LAB_0013421d:
    ppuStack_4d88 = (undefined **)0x134222;
    test_bson_json_number_decimal_cold_3();
LAB_00134222:
    ppuStack_4d88 = (undefined **)0x134227;
    test_bson_json_number_decimal_cold_4();
LAB_00134227:
    ppuStack_4d88 = (undefined **)0x13422c;
    test_bson_json_number_decimal_cold_5();
  }
  else {
    ppuStack_4d88 = (undefined **)0x1341c2;
    cVar1 = bson_iter_find(auStack_4d00,"key");
    if (cVar1 == '\0') goto LAB_0013421d;
    ppuStack_4d88 = (undefined **)0x1341d3;
    iVar2 = bson_iter_type(auStack_4d00);
    if (iVar2 != 0x13) goto LAB_00134222;
    plVar15 = &lStack_4d10;
    ppuStack_4d88 = (undefined **)0x1341ed;
    bson_iter_decimal128(auStack_4d00,plVar15);
    if (lStack_4d10 != 0xb) goto LAB_00134227;
    if (lStack_4d08 == 0x3040000000000000) {
      ppuStack_4d88 = (undefined **)0x134211;
      bson_destroy(auStack_4c80);
      return;
    }
  }
  ppuStack_4d88 = (undefined **)0x134231;
  test_bson_json_number_decimal_cold_6();
LAB_00134231:
  ppuStack_4d88 = (undefined **)test_bson_json_errors;
  test_bson_json_number_decimal_cold_1();
  pcVar7 = "{\"x\": {\"$numberLong\": 1}}";
  ppuVar23 = &PTR_anon_var_dwarf_1b1c7_00163470;
  plStack_4da0 = plVar15;
  pcStack_4d98 = pcVar26;
  pcStack_4d90 = pcVar18;
  ppuStack_4d88 = ppuVar21;
  do {
    pcStack_4fb0 = (code *)0x134273;
    lVar6 = bson_new_from_json(pcVar7,0xffffffffffffffff,&iStack_4fa0);
    if (lVar6 != 0) {
      pcStack_4fb0 = (code *)0x1342c0;
      test_bson_json_errors_cold_1();
LAB_001342c0:
      pcStack_4fb0 = (code *)0x1342de;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_4f98,
              ppuVar21);
      pcStack_4fb0 = (code *)0x1342e3;
      abort();
    }
    if (iStack_4fa0 != 1) {
LAB_001342e8:
      pcStack_4fb0 = test_bson_integer_width;
      test_bson_json_errors_cold_2();
      pcStack_51c8 = (code *)0x13430d;
      pcStack_4fb8 = acStack_4f98;
      pcStack_4fb0 = (code *)&iStack_4fa0;
      pcVar26 = (char *)bson_new_from_json("{\"v\":-1234567890123, \"x\":12345678901234}",0x28,
                                           auStack_51b8);
      pcStack_51c8 = (code *)0x13431a;
      pcVar18 = (char *)bson_as_json(pcVar26,0);
      if (pcVar18 == "{ \"v\" : -1234567890123, \"x\" : 12345678901234 }") {
LAB_0013433c:
        pcStack_51c8 = (code *)0x134344;
        bson_free(pcVar18);
        pcStack_51c8 = (code *)0x13434c;
        bson_destroy(pcVar26);
        return;
      }
      pcStack_51c8 = (code *)0x134338;
      iVar2 = strcmp(pcVar18,"{ \"v\" : -1234567890123, \"x\" : 12345678901234 }");
      if (iVar2 == 0) goto LAB_0013433c;
      pcStack_51c8 = test_bson_json_null_in_str;
      test_bson_integer_width_cold_1();
      uStack_53d8 = 0x2200223a2261227b;
      uStack_53d0 = 0x7d;
      uStack_53dc = 0x227b;
      pcStack_51c8 = (code *)pcVar26;
      lVar6 = bson_new_from_json(&uStack_53d8,9,&iStack_53c8);
      if (lVar6 == 0) {
        if (iStack_53c8 != 1) goto LAB_00134418;
        if (iStack_53c4 != 1) goto LAB_0013441d;
        pcVar26 = acStack_53c0;
        pcVar7 = strstr(pcVar26,"Got parse error");
        if (pcVar7 == (char *)0x0) goto LAB_00134422;
        lVar6 = bson_new_from_json(&uStack_53dc,3,&iStack_53c8);
        if (lVar6 != 0) goto LAB_00134413;
        if (iStack_53c8 != 1) goto LAB_0013442a;
        if (iStack_53c4 == 1) {
          pcVar7 = strstr(pcVar26,"Got parse error");
          if (pcVar7 != (char *)0x0) {
            return;
          }
          goto LAB_00134434;
        }
      }
      else {
        test_bson_json_null_in_str_cold_1();
LAB_00134413:
        test_bson_json_null_in_str_cold_4();
LAB_00134418:
        test_bson_json_null_in_str_cold_2();
LAB_0013441d:
        test_bson_json_null_in_str_cold_3();
LAB_00134422:
        test_bson_json_null_in_str_cold_8();
LAB_0013442a:
        test_bson_json_null_in_str_cold_5();
      }
      test_bson_json_null_in_str_cold_6();
LAB_00134434:
      test_bson_json_null_in_str_cold_7();
      uVar5 = extraout_RAX_04;
      _test_json_produces_multiple("[],[{\'\'",1,0,0);
      _test_json_produces_multiple("{},[{\'\'",1,0,0);
      uVar8 = bson_bcon_magic();
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,0,uVar5,pcVar26,ppuVar23,ppuVar25,pcVar18,ppuVar21,ppcVar30
                      );
      uVar16 = bcon_new(0,"b",uVar8,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1} {\'b\': 1}",0,uVar5,uVar16,0);
      uVar5 = bson_new();
      uVar16 = bson_new();
      uVar17 = bson_new();
      _test_json_produces_multiple("{}{}{}",0,uVar5,uVar16,uVar17,0);
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,"b",uVar8,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1}, {\'b\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,0);
      _test_json_produces_multiple("{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,0);
      _test_json_produces_multiple("{},{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,0);
      _test_json_produces_multiple("[],{\'a\': 1}",0,uVar5,0);
      uVar5 = bson_new();
      _test_json_produces_multiple("[]",0,uVar5,0);
      uVar5 = bcon_new(0,"0","{","x",uVar8,0xf,0,"}",0);
      _test_json_produces_multiple("[{\'x\': 0}]",0,uVar5,0);
      _test_json_produces_multiple("[],[{\'a\': 1}]",1,0,0);
      return;
    }
    if (iStack_4f9c != 2) {
      pcStack_4fb0 = (code *)0x1342e8;
      test_bson_json_errors_cold_3();
      goto LAB_001342e8;
    }
    ppuVar21 = (undefined **)ppuVar23[-1];
    pcStack_4fb0 = (code *)0x13429a;
    pcVar26 = strstr(acStack_4f98,(char *)ppuVar21);
    if (pcVar26 == (char *)0x0) goto LAB_001342c0;
    pcVar7 = *ppuVar23;
    ppuVar23 = ppuVar23 + 2;
    if (pcVar7 == (char *)0x0) {
      return;
    }
  } while( true );
LAB_00133b35:
  apcStack_3d88[0] = (code *)0x133b3a;
  test_bson_json_nan_cold_11();
  goto LAB_00133b3a;
LAB_00133ddf:
  apcStack_4188[0] = (code *)0x133de4;
  test_bson_json_infinity_cold_4();
LAB_00133de4:
  apcStack_4188[0] = (code *)0x133de9;
  test_bson_json_infinity_cold_5();
LAB_00133de9:
  apcStack_4188[0] = (code *)0x133dee;
  test_bson_json_infinity_cold_6();
LAB_00133dee:
  ppuVar25 = &puStack_4108;
  pcVar26 = "d";
  apcStack_4188[0] = (code *)0x133df3;
  test_bson_json_infinity_cold_7();
LAB_00133df3:
  apcStack_4188[0] = (code *)0x133df8;
  test_bson_json_infinity_cold_15();
  goto LAB_00133df8;
}

Assistant:

static void
test_bson_json_read_legacy_binary (void)
{
   const char *jsons[] = {"{\"x\": {\"$binary\": \"Zm9v\", \"$type\": \"05\"}}",
                          "{\"x\": {\"$type\": \"05\", \"$binary\": \"Zm9v\"}}",
                          NULL};

   const char **json;
   bson_error_t error;
   bson_t b;
   bool r;
   bson_subtype_t subtype;
   uint32_t len;
   const uint8_t *binary;

   for (json = jsons; *json; json++) {
      r = bson_init_from_json (&b, *json, -1, &error);

      ASSERT_OR_PRINT (r, error);
      BCON_EXTRACT (&b, "x", BCONE_BIN (subtype, binary, len));
      ASSERT_CMPINT ((int) subtype, ==, 5);
      ASSERT_CMPUINT32 (len, ==, (uint32_t) 3);
      ASSERT_CMPSTR ((const char *) binary, "foo");

      bson_destroy (&b);
   }
}